

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_tests.cpp
# Opt level: O2

void (anonymous_namespace)::run_tests<false,6>(void)

{
  rrb<int,_false,_6> *__src;
  int expval;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last_00;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last_01;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last_02;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last_03;
  bool bVar1;
  size_type_conflict sVar2;
  uint32_t uVar3;
  int iVar4;
  int *piVar5;
  const_reference piVar6;
  reference piVar7;
  reference piVar8;
  vector<char,_false,_6> *pvVar9;
  reference pcVar10;
  uint32_t i_2;
  uint uVar11;
  undefined1 *puVar12;
  vector<int,_false,_6> vVar13;
  vector<int,_std::allocator<int>_> *__range2;
  uint32_t i_12;
  long lVar14;
  size_type_conflict pos;
  uint uVar15;
  int *v_3;
  long lVar16;
  ulong uVar17;
  pointer piVar18;
  pointer puVar19;
  pointer puVar20;
  pointer pvVar21;
  uint32_t i_1;
  ulong uVar22;
  uint32_t i;
  int iVar23;
  long lVar24;
  ulong uVar25;
  int *v_2;
  vector<int,_false,_6> v3;
  size_type_conflict local_2c0;
  undefined4 uStack_2bc;
  vector<unsigned_int,_std::allocator<unsigned_int>_> lookups;
  vector<int,_false,_6> vec_5;
  size_type_conflict local_280;
  undefined4 uStack_27c;
  vector<int,_std::allocator<int>_> list4;
  transient_type tvec_3;
  vector<int,_false,_6> vec2;
  vector<int,_false,_6> old_vec;
  size_type_conflict local_238;
  undefined4 uStack_234;
  vector<int,_false,_6> vec3;
  vector<int,_false,_6> vec1;
  vector<int,_false,_6> vec4;
  vector<int,_false,_6> vec_11;
  ulong local_200;
  vector<int,_std::allocator<int>_> list_10;
  vector<int,_false,_6> v;
  rrb<int,_false,_6> *local_1c8;
  _Tuple_impl<1UL,_unsigned_int,_unsigned_int> local_1c0;
  _Head_base<0UL,_const_int_*,_false> local_1b8;
  ref<immutable::transient_rrb<int,_false,_6>_> local_48;
  ref<immutable::transient_rrb<int,_false,_6>_> local_40;
  ulong local_38;
  
  immutable::rrb_create<int,false,6>();
  bVar1 = immutable::vector<int,_false,_6>::empty(&v);
  TestEq<bool,bool>(true,bVar1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                    ,0xf,
                    "void (anonymous namespace)::test_empty_vector() [atomic_ref_counting = false, N = 6]"
                   );
  sVar2 = immutable::vector<int,_false,_6>::size(&v);
  TestEq<int,unsigned_int>
            (0,sVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
             ,0x10,
             "void (anonymous namespace)::test_empty_vector() [atomic_ref_counting = false, N = 6]")
  ;
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&v._impl);
  immutable::rrb_create<int,false,6>();
  immutable::vector<int,_false,_6>::push_back(&v3,(value_type_conflict)&v);
  pos = (size_type_conflict)&v3;
  immutable::vector<int,_false,_6>::push_back((vector<int,_false,_6> *)&lookups,pos);
  bVar1 = immutable::vector<int,_false,_6>::empty(&v);
  TestEq<bool,bool>(true,bVar1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                    ,0x19,
                    "void (anonymous namespace)::test_push_back_simple() [atomic_ref_counting = false, N = 6]"
                   );
  sVar2 = immutable::vector<int,_false,_6>::size(&v);
  TestEq<int,unsigned_int>
            (0,sVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
             ,0x1a,
             "void (anonymous namespace)::test_push_back_simple() [atomic_ref_counting = false, N = 6]"
            );
  sVar2 = immutable::vector<int,_false,_6>::size(&v3);
  TestEq<int,unsigned_int>
            (1,sVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
             ,0x1b,
             "void (anonymous namespace)::test_push_back_simple() [atomic_ref_counting = false, N = 6]"
            );
  sVar2 = immutable::vector<int,_false,_6>::size((vector<int,_false,_6> *)&lookups);
  TestEq<int,unsigned_int>
            (2,sVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
             ,0x1c,
             "void (anonymous namespace)::test_push_back_simple() [atomic_ref_counting = false, N = 6]"
            );
  piVar5 = immutable::rrb_nth<int,false,6>(&v3._impl,0);
  TestEq<int,int>(3,*piVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                  ,0x1d,
                  "void (anonymous namespace)::test_push_back_simple() [atomic_ref_counting = false, N = 6]"
                 );
  piVar5 = immutable::rrb_nth<int,false,6>((ref<immutable::rrb<int,_false,_6>_> *)&lookups,0);
  TestEq<int,int>(3,*piVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                  ,0x1e,
                  "void (anonymous namespace)::test_push_back_simple() [atomic_ref_counting = false, N = 6]"
                 );
  uVar15 = 1;
  piVar5 = immutable::rrb_nth<int,false,6>((ref<immutable::rrb<int,_false,_6>_> *)&lookups,1);
  TestEq<int,int>(7,*piVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                  ,0x1f,
                  "void (anonymous namespace)::test_push_back_simple() [atomic_ref_counting = false, N = 6]"
                 );
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
            ((ref<immutable::rrb<int,_false,_6>_> *)&lookups);
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&v3._impl);
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&v._impl);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&v,40000,(allocator_type *)&v3);
  for (vVar13 = v; vVar13._impl.ptr != (ref<immutable::rrb<int,_false,_6>_>)local_1c8;
      vVar13._impl.ptr =
           (ref<immutable::rrb<int,_false,_6>_>)&((rrb<int,_false,_6> *)vVar13._impl.ptr)->shift) {
    uVar3 = rand();
    ((rrb<int,_false,_6> *)vVar13._impl.ptr)->cnt = uVar3;
  }
  immutable::rrb_create<int,false,6>();
  for (vVar13 = v; vVar13._impl.ptr != (ref<immutable::rrb<int,_false,_6>_>)local_1c8;
      vVar13._impl.ptr =
           (ref<immutable::rrb<int,_false,_6>_>)&((rrb<int,_false,_6> *)vVar13._impl.ptr)->shift) {
    immutable::vector<int,_false,_6>::push_back((vector<int,_false,_6> *)&lookups,pos);
    immutable::ref<immutable::rrb<int,_false,_6>_>::operator=
              (&v3._impl,(ref<immutable::rrb<int,_false,_6>_> *)&lookups);
    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
              ((ref<immutable::rrb<int,_false,_6>_> *)&lookups);
  }
  for (lVar24 = 0; lVar24 != 40000; lVar24 = lVar24 + 1) {
    iVar4 = *(int *)((long)v._impl.ptr + lVar24 * 4);
    piVar5 = immutable::rrb_nth<int,false,6>(&v3._impl,(uint32_t)lVar24);
    TestEq<int,int>(iVar4,*piVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                    ,0x30,
                    "void (anonymous namespace)::test_push_back(uint32_t) [atomic_ref_counting = false, N = 6]"
                   );
  }
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&v3._impl);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&v);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&v,40000,(allocator_type *)&v3);
  for (vVar13 = v; vVar13._impl.ptr != (ref<immutable::rrb<int,_false,_6>_>)local_1c8;
      vVar13._impl.ptr =
           (ref<immutable::rrb<int,_false,_6>_>)&((rrb<int,_false,_6> *)vVar13._impl.ptr)->shift) {
    uVar3 = rand();
    ((rrb<int,_false,_6> *)vVar13._impl.ptr)->cnt = uVar3;
  }
  immutable::rrb_create<int,false,6>();
  for (vVar13 = v; vVar13._impl.ptr != (ref<immutable::rrb<int,_false,_6>_>)local_1c8;
      vVar13._impl.ptr =
           (ref<immutable::rrb<int,_false,_6>_>)&((rrb<int,_false,_6> *)vVar13._impl.ptr)->shift) {
    immutable::vector<int,_false,_6>::push_back((vector<int,_false,_6> *)&lookups,pos);
    immutable::ref<immutable::rrb<int,_false,_6>_>::operator=
              (&v3._impl,(ref<immutable::rrb<int,_false,_6>_> *)&lookups);
    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
              ((ref<immutable::rrb<int,_false,_6>_> *)&lookups);
    piVar6 = immutable::vector<int,_false,_6>::front(&v3);
    TestEq<int,int>(*(int *)v._impl.ptr,*piVar6,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                    ,0x3f,
                    "void (anonymous namespace)::test_front(uint32_t) [atomic_ref_counting = false, N = 6]"
                   );
  }
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&v3._impl);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&v);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&v,40000,(allocator_type *)&v3);
  for (vVar13 = v; vVar13._impl.ptr != (ref<immutable::rrb<int,_false,_6>_>)local_1c8;
      vVar13._impl.ptr =
           (ref<immutable::rrb<int,_false,_6>_>)&((rrb<int,_false,_6> *)vVar13._impl.ptr)->shift) {
    uVar3 = rand();
    ((rrb<int,_false,_6> *)vVar13._impl.ptr)->cnt = uVar3;
  }
  immutable::rrb_create<int,false,6>();
  for (vVar13 = v; vVar13._impl.ptr != (ref<immutable::rrb<int,_false,_6>_>)local_1c8;
      vVar13._impl.ptr =
           (ref<immutable::rrb<int,_false,_6>_>)&((rrb<int,_false,_6> *)vVar13._impl.ptr)->shift) {
    immutable::vector<int,_false,_6>::push_back((vector<int,_false,_6> *)&lookups,pos);
    immutable::ref<immutable::rrb<int,_false,_6>_>::operator=
              (&v3._impl,(ref<immutable::rrb<int,_false,_6>_> *)&lookups);
    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
              ((ref<immutable::rrb<int,_false,_6>_> *)&lookups);
    piVar5 = immutable::rrb_peek<int,false,6>(&v3._impl);
    TestEq<int,int>(((rrb<int,_false,_6> *)vVar13._impl.ptr)->cnt,*piVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                    ,0x4f,
                    "void (anonymous namespace)::test_back(uint32_t) [atomic_ref_counting = false, N = 6]"
                   );
  }
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&v3._impl);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&v);
  immutable::rrb_create<int,false,6>();
  for (; uVar15 != 0x9c41; uVar15 = uVar15 + 1) {
    immutable::vector<int,_false,_6>::push_back
              (&v3,(value_type_conflict)(_Vector_base<int,_std::allocator<int>_> *)&v);
    immutable::ref<immutable::rrb<int,_false,_6>_>::operator=
              ((ref<immutable::rrb<int,_false,_6>_> *)&v,&v3._impl);
    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&v3._impl);
    sVar2 = immutable::vector<int,_false,_6>::size(&v);
    TestEq<unsigned_int,unsigned_int>
              (uVar15,sVar2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
               ,0x5a,
               "void (anonymous namespace)::test_size(uint32_t) [atomic_ref_counting = false, N = 6]"
              );
  }
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&v._impl);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&v,40000,(allocator_type *)&v3);
  for (vVar13 = v; vVar13._impl.ptr != (ref<immutable::rrb<int,_false,_6>_>)local_1c8;
      vVar13._impl.ptr =
           (ref<immutable::rrb<int,_false,_6>_>)&((rrb<int,_false,_6> *)vVar13._impl.ptr)->shift) {
    uVar3 = rand();
    ((rrb<int,_false,_6> *)vVar13._impl.ptr)->cnt = uVar3;
  }
  immutable::rrb_create<int,false,6>();
  for (lVar24 = 0; lVar24 != 40000; lVar24 = lVar24 + 1) {
    immutable::vector<int,_false,_6>::push_back((vector<int,_false,_6> *)&lookups,pos);
    immutable::ref<immutable::rrb<int,_false,_6>_>::operator=
              (&v3._impl,(ref<immutable::rrb<int,_false,_6>_> *)&lookups);
    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
              ((ref<immutable::rrb<int,_false,_6>_> *)&lookups);
    if (lVar24 != 0) {
      immutable::vector<int,_false,_6>::pop_back((vector<int,_false,_6> *)&lookups);
      piVar5 = immutable::rrb_peek<int,false,6>((ref<immutable::rrb<int,_false,_6>_> *)&lookups);
      TestEq<int,int>(*piVar5,*(int *)((long)v._impl.ptr + -4 + lVar24 * 4),
                      "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                      ,0x6e,
                      "void (anonymous namespace)::test_pop_back(uint32_t) [atomic_ref_counting = false, N = 6]"
                     );
      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                ((ref<immutable::rrb<int,_false,_6>_> *)&lookups);
    }
  }
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&v3._impl);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&v);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&v,400000,(allocator_type *)&v3);
  for (vVar13 = v; vVar13._impl.ptr != (ref<immutable::rrb<int,_false,_6>_>)local_1c8;
      vVar13._impl.ptr =
           (ref<immutable::rrb<int,_false,_6>_>)&((rrb<int,_false,_6> *)vVar13._impl.ptr)->shift) {
    uVar3 = rand();
    ((rrb<int,_false,_6> *)vVar13._impl.ptr)->cnt = uVar3;
  }
  immutable::rrb_create<int,false,6>();
  for (lVar24 = 0; lVar24 != 400000; lVar24 = lVar24 + 1) {
    immutable::vector<int,_false,_6>::push_back(&v3,(value_type_conflict)&vec_5);
    immutable::ref<immutable::rrb<int,_false,_6>_>::operator=(&vec_5._impl,&v3._impl);
    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&v3._impl);
  }
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&v3,0x208d9,(allocator_type *)&lookups);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&lookups,0x208d9,(allocator_type *)&old_vec);
  for (lVar24 = 0; lVar24 != 0x208d9; lVar24 = lVar24 + 1) {
    iVar4 = rand();
    *(int *)((long)v3._impl.ptr + lVar24 * 4) = iVar4;
    uVar15 = rand();
    lookups.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[lVar24] = uVar15 % 400000;
  }
  for (lVar24 = 0; lVar24 != 0x208d9; lVar24 = lVar24 + 1) {
    uVar15 = lookups.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[lVar24];
    old_vec = vec_5;
    if (vec_5._impl.ptr != (rrb<int,_false,_6> *)0x0) {
      *(int *)((long)vec_5._impl.ptr + 0x20) = *(int *)((long)vec_5._impl.ptr + 0x20) + 1;
    }
    immutable::vector<int,_false,_6>::set
              ((vector<int,_false,_6> *)&list4,(size_type_conflict)&vec_5,uVar15);
    immutable::ref<immutable::rrb<int,_false,_6>_>::operator=
              (&vec_5._impl,(ref<immutable::rrb<int,_false,_6>_> *)&list4);
    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
              ((ref<immutable::rrb<int,_false,_6>_> *)&list4);
    piVar5 = immutable::rrb_nth<int,false,6>(&old_vec._impl,uVar15);
    iVar4 = *piVar5;
    piVar5 = immutable::rrb_nth<int,false,6>(&vec_5._impl,uVar15);
    iVar23 = *piVar5;
    TestEq<int,int>(iVar4,*(int *)((long)v._impl.ptr + (ulong)uVar15 * 4),
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                    ,0x8f,
                    "void (anonymous namespace)::test_update(uint32_t, uint32_t) [atomic_ref_counting = false, N = 6]"
                   );
    TestEq<int,int>(iVar23,*(int *)((long)v3._impl.ptr + lVar24 * 4),
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                    ,0x90,
                    "void (anonymous namespace)::test_update(uint32_t, uint32_t) [atomic_ref_counting = false, N = 6]"
                   );
    *(int *)((long)v._impl.ptr + (ulong)uVar15 * 4) = iVar23;
    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&old_vec._impl);
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&lookups.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&v3);
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&vec_5._impl);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&v);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&v,10000,(allocator_type *)&v3);
  for (vVar13 = v; vVar13._impl.ptr != (ref<immutable::rrb<int,_false,_6>_>)local_1c8;
      vVar13._impl.ptr =
           (ref<immutable::rrb<int,_false,_6>_>)&((rrb<int,_false,_6> *)vVar13._impl.ptr)->shift) {
    uVar3 = rand();
    ((rrb<int,_false,_6> *)vVar13._impl.ptr)->cnt = uVar3;
  }
  immutable::rrb_create<int,false,6>();
  for (lVar24 = 0; lVar24 != 10000; lVar24 = lVar24 + 1) {
    immutable::vector<int,_false,_6>::push_back((vector<int,_false,_6> *)&lookups,pos);
    immutable::ref<immutable::rrb<int,_false,_6>_>::operator=
              (&v3._impl,(ref<immutable::rrb<int,_false,_6>_> *)&lookups);
    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
              ((ref<immutable::rrb<int,_false,_6>_> *)&lookups);
  }
  __src = (rrb<int,_false,_6> *)((long)v._impl.ptr + 0x4e24);
  if (__src != local_1c8) {
    memmove((void *)((long)v._impl.ptr + 20000),__src,(long)local_1c8 - (long)__src);
  }
  puVar12 = &local_1c8[-1].field_0x24;
  immutable::vector<int,_false,_6>::erase((vector<int,_false,_6> *)&lookups,pos);
  immutable::ref<immutable::rrb<int,_false,_6>_>::operator=
            (&v3._impl,(ref<immutable::rrb<int,_false,_6>_> *)&lookups);
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
            ((ref<immutable::rrb<int,_false,_6>_> *)&lookups);
  sVar2 = immutable::vector<int,_false,_6>::size(&v3);
  TestEq<unsigned_int,unsigned_long>
            (sVar2,(long)puVar12 - (long)v._impl.ptr >> 2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
             ,200,
             "void (anonymous namespace)::test_erase_single(uint32_t) [atomic_ref_counting = false, N = 6]"
            );
  for (lVar24 = 0; lVar24 != 9999; lVar24 = lVar24 + 1) {
    iVar4 = *(int *)((long)v._impl.ptr + lVar24 * 4);
    piVar5 = immutable::rrb_nth<int,false,6>(&v3._impl,(uint32_t)lVar24);
    TestEq<int,int>(iVar4,*piVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                    ,0xcb,
                    "void (anonymous namespace)::test_erase_single(uint32_t) [atomic_ref_counting = false, N = 6]"
                   );
  }
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&v3._impl);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&v);
  test_erase<false,6>(200,0x32);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&v,10000,(allocator_type *)&v3);
  for (vVar13 = v; vVar13._impl.ptr != (ref<immutable::rrb<int,_false,_6>_>)puVar12;
      vVar13._impl.ptr =
           (ref<immutable::rrb<int,_false,_6>_>)&((rrb<int,_false,_6> *)vVar13._impl.ptr)->shift) {
    uVar3 = rand();
    ((rrb<int,_false,_6> *)vVar13._impl.ptr)->cnt = uVar3;
  }
  immutable::rrb_create<int,false,6>();
  for (lVar24 = 0; lVar24 != 10000; lVar24 = lVar24 + 1) {
    immutable::vector<int,_false,_6>::push_back((vector<int,_false,_6> *)&lookups,pos);
    immutable::ref<immutable::rrb<int,_false,_6>_>::operator=
              (&v3._impl,(ref<immutable::rrb<int,_false,_6>_> *)&lookups);
    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
              ((ref<immutable::rrb<int,_false,_6>_> *)&lookups);
  }
  lookups.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(lookups.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,0x29a);
  std::vector<int,_std::allocator<int>_>::_M_insert_rval
            ((vector<int,_std::allocator<int>_> *)&v,(int *)((long)v._impl.ptr + 20000),
             (value_type_conflict *)&lookups);
  immutable::vector<int,_false,_6>::insert((vector<int,_false,_6> *)&lookups,pos,5000);
  immutable::ref<immutable::rrb<int,_false,_6>_>::operator=
            (&v3._impl,(ref<immutable::rrb<int,_false,_6>_> *)&lookups);
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
            ((ref<immutable::rrb<int,_false,_6>_> *)&lookups);
  sVar2 = immutable::vector<int,_false,_6>::size(&v3);
  TestEq<unsigned_int,unsigned_long>
            (sVar2,(long)puVar12 - (long)v._impl.ptr >> 2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
             ,0x106,
             "void (anonymous namespace)::test_insert_single(uint32_t) [atomic_ref_counting = false, N = 6]"
            );
  for (lVar24 = 0; lVar24 != 0x2711; lVar24 = lVar24 + 1) {
    iVar4 = *(int *)((long)v._impl.ptr + lVar24 * 4);
    piVar5 = immutable::rrb_nth<int,false,6>(&v3._impl,(uint32_t)lVar24);
    TestEq<int,int>(iVar4,*piVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                    ,0x109,
                    "void (anonymous namespace)::test_insert_single(uint32_t) [atomic_ref_counting = false, N = 6]"
                   );
  }
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&v3._impl);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&v);
  test_concat<false,6>(200);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&v,10000,(allocator_type *)&v3);
  for (vVar13 = v; vVar13._impl.ptr != (ref<immutable::rrb<int,_false,_6>_>)puVar12;
      vVar13._impl.ptr =
           (ref<immutable::rrb<int,_false,_6>_>)&((rrb<int,_false,_6> *)vVar13._impl.ptr)->shift) {
    uVar3 = rand();
    ((rrb<int,_false,_6> *)vVar13._impl.ptr)->cnt = uVar3;
  }
  immutable::rrb_create<int,false,6>();
  for (lVar24 = 0; lVar24 != 10000; lVar24 = lVar24 + 1) {
    immutable::vector<int,_false,_6>::push_back((vector<int,_false,_6> *)&lookups,pos);
    immutable::ref<immutable::rrb<int,_false,_6>_>::operator=
              (&v3._impl,(ref<immutable::rrb<int,_false,_6>_> *)&lookups);
    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
              ((ref<immutable::rrb<int,_false,_6>_> *)&lookups);
  }
  immutable::vector<int,_false,_6>::drop((vector<int,_false,_6> *)&lookups,pos);
  immutable::ref<immutable::rrb<int,_false,_6>_>::operator=
            (&v3._impl,(ref<immutable::rrb<int,_false,_6>_> *)&lookups);
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
            ((ref<immutable::rrb<int,_false,_6>_> *)&lookups);
  for (lVar24 = 0; lVar24 != 0x270d; lVar24 = lVar24 + 1) {
    iVar4 = *(int *)((long)v._impl.ptr + 0xc + lVar24 * 4);
    piVar5 = immutable::rrb_nth<int,false,6>(&v3._impl,(uint32_t)lVar24);
    TestEq<int,int>(iVar4,*piVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                    ,0x139,
                    "void (anonymous namespace)::test_drop(uint32_t) [atomic_ref_counting = false, N = 6]"
                   );
  }
  sVar2 = immutable::vector<int,_false,_6>::size(&v3);
  TestEq<unsigned_int,unsigned_int>
            (0x270d,sVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
             ,0x13b,
             "void (anonymous namespace)::test_drop(uint32_t) [atomic_ref_counting = false, N = 6]")
  ;
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&v3._impl);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&v);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&v,10000,(allocator_type *)&v3);
  for (vVar13 = v; vVar13._impl.ptr != (ref<immutable::rrb<int,_false,_6>_>)puVar12;
      vVar13._impl.ptr =
           (ref<immutable::rrb<int,_false,_6>_>)&((rrb<int,_false,_6> *)vVar13._impl.ptr)->shift) {
    uVar3 = rand();
    ((rrb<int,_false,_6> *)vVar13._impl.ptr)->cnt = uVar3;
  }
  immutable::rrb_create<int,false,6>();
  for (lVar24 = 0; lVar24 != 10000; lVar24 = lVar24 + 1) {
    immutable::vector<int,_false,_6>::push_back((vector<int,_false,_6> *)&lookups,pos);
    immutable::ref<immutable::rrb<int,_false,_6>_>::operator=
              (&v3._impl,(ref<immutable::rrb<int,_false,_6>_> *)&lookups);
    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
              ((ref<immutable::rrb<int,_false,_6>_> *)&lookups);
  }
  immutable::vector<int,_false,_6>::take((vector<int,_false,_6> *)&lookups,pos);
  immutable::ref<immutable::rrb<int,_false,_6>_>::operator=
            (&v3._impl,(ref<immutable::rrb<int,_false,_6>_> *)&lookups);
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
            ((ref<immutable::rrb<int,_false,_6>_> *)&lookups);
  for (lVar24 = 0; lVar24 != 3; lVar24 = lVar24 + 1) {
    iVar4 = *(int *)((long)v._impl.ptr + lVar24 * 4);
    piVar5 = immutable::rrb_nth<int,false,6>(&v3._impl,(uint32_t)lVar24);
    TestEq<int,int>(iVar4,*piVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                    ,0x14e,
                    "void (anonymous namespace)::test_take(uint32_t) [atomic_ref_counting = false, N = 6]"
                   );
  }
  sVar2 = immutable::vector<int,_false,_6>::size(&v3);
  TestEq<int,unsigned_int>
            (3,sVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
             ,0x150,
             "void (anonymous namespace)::test_take(uint32_t) [atomic_ref_counting = false, N = 6]")
  ;
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&v3._impl);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&v);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&lookups,10000,(allocator_type *)&v);
  puVar19 = lookups.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (puVar20 = lookups.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start; puVar20 != puVar19; puVar20 = puVar20 + 1) {
    uVar15 = rand();
    *puVar20 = uVar15;
  }
  immutable::rrb_create<int,false,6>();
  for (lVar24 = 0; vVar13._impl.ptr = vec_5._impl.ptr,
      puVar19 = lookups.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start, lVar24 != 10000; lVar24 = lVar24 + 1) {
    immutable::vector<int,_false,_6>::push_back(&v,(value_type_conflict)&vec_5);
    immutable::ref<immutable::rrb<int,_false,_6>_>::operator=(&vec_5._impl,&v._impl);
    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&v._impl);
  }
  v = vec_5;
  if (vec_5._impl.ptr != (rrb<int,_false,_6> *)0x0) {
    *(int *)((long)vec_5._impl.ptr + 0x20) = *(int *)((long)vec_5._impl.ptr + 0x20) + 1;
  }
  local_1c8 = (rrb<int,_false,_6> *)((ulong)puVar12 & 0xffffffff00000000);
  local_1c0.super__Tuple_impl<2UL,_unsigned_int>.super__Head_base<2UL,_unsigned_int,_false>.
  _M_head_impl = (_Head_base<2UL,_unsigned_int,_false>)0xffffffff;
  local_1c0.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl = 0xffffffff;
  local_1b8._M_head_impl = (int *)0x0;
  immutable::vector_iterator<int,_false,_6>::vector_iterator
            ((vector_iterator<int,_false,_6> *)&v3,&vec_5);
  sVar2 = 0;
  while ((sVar2 != local_2c0 || (vVar13._impl.ptr != v3._impl.ptr))) {
    piVar7 = immutable::vector_iterator<int,_false,_6>::operator*
                       ((vector_iterator<int,_false,_6> *)&v);
    TestEq<int,int>(*piVar7,*puVar19,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                    ,0x168,
                    "void (anonymous namespace)::test_iterator(uint32_t) [atomic_ref_counting = false, N = 6]"
                   );
    sVar2 = (size_type_conflict)local_1c8 + 1;
    local_1c8 = (rrb<int,_false,_6> *)CONCAT44(local_1c8._4_4_,sVar2);
    puVar19 = puVar19 + 1;
    vVar13 = v;
  }
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&v3._impl);
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&v._impl);
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&vec_5._impl);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&lookups);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&lookups,1000,(allocator_type *)&v);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&vec_5,1000,(allocator_type *)&v);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&old_vec,1000,(allocator_type *)&v);
  std::vector<int,_std::allocator<int>_>::vector(&list4,1000,(allocator_type *)&v);
  puVar19 = lookups.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (puVar20 = lookups.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start; puVar20 != puVar19; puVar20 = puVar20 + 1) {
    uVar15 = rand();
    *puVar20 = uVar15;
  }
  for (vVar13._impl.ptr = vec_5._impl.ptr;
      vVar13._impl.ptr != (rrb<int,_false,_6> *)CONCAT44(uStack_27c,local_280);
      vVar13._impl.ptr =
           (ref<immutable::rrb<int,_false,_6>_>)&((rrb<int,_false,_6> *)vVar13._impl.ptr)->shift) {
    uVar3 = rand();
    ((rrb<int,_false,_6> *)vVar13._impl.ptr)->cnt = uVar3;
  }
  for (vVar13._impl.ptr = old_vec._impl.ptr;
      piVar18 = list4.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish,
      piVar5 = list4.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start, vVar13._impl.ptr != (rrb<int,_false,_6> *)CONCAT44(uStack_234,local_238);
      vVar13._impl.ptr =
           (ref<immutable::rrb<int,_false,_6>_>)&((rrb<int,_false,_6> *)vVar13._impl.ptr)->shift) {
    uVar3 = rand();
    ((rrb<int,_false,_6> *)vVar13._impl.ptr)->cnt = uVar3;
  }
  for (; piVar5 != piVar18; piVar5 = piVar5 + 1) {
    iVar4 = rand();
    *piVar5 = iVar4;
  }
  immutable::rrb_create<int,false,6>();
  immutable::rrb_create<int,false,6>();
  immutable::rrb_create<int,false,6>();
  immutable::rrb_create<int,false,6>();
  for (lVar24 = 0; lVar24 != 1000; lVar24 = lVar24 + 1) {
    immutable::vector<int,_false,_6>::push_back(&v,(value_type_conflict)&vec1);
    immutable::ref<immutable::rrb<int,_false,_6>_>::operator=(&vec1._impl,&v._impl);
    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&v._impl);
    immutable::vector<int,_false,_6>::push_back(&v,(value_type_conflict)&vec2);
    immutable::ref<immutable::rrb<int,_false,_6>_>::operator=(&vec2._impl,&v._impl);
    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&v._impl);
    immutable::vector<int,_false,_6>::push_back(&v,(value_type_conflict)&vec3);
    immutable::ref<immutable::rrb<int,_false,_6>_>::operator=(&vec3._impl,&v._impl);
    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&v._impl);
    immutable::vector<int,_false,_6>::push_back(&v,(value_type_conflict)&vec4);
    immutable::ref<immutable::rrb<int,_false,_6>_>::operator=(&vec4._impl,&v._impl);
    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&v._impl);
  }
  list_10.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  list_10.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  list_10.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  std::vector<int,std::allocator<int>>::
  insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
            ((vector<int,std::allocator<int>> *)&list_10,(const_iterator)0x0,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             lookups.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             lookups.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish);
  __last_00._M_current._4_4_ = uStack_27c;
  __last_00._M_current._0_4_ = local_280;
  std::vector<int,std::allocator<int>>::
  insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
            ((vector<int,std::allocator<int>> *)&list_10,
             (const_iterator)
             list_10.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)vec_5._impl.ptr,
             __last_00);
  __last_02._M_current._4_4_ = uStack_234;
  __last_02._M_current._0_4_ = local_238;
  std::vector<int,std::allocator<int>>::
  insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
            ((vector<int,std::allocator<int>> *)&list_10,
             (const_iterator)
             list_10.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)old_vec._impl.ptr,
             __last_02);
  std::vector<int,std::allocator<int>>::
  insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
            ((vector<int,std::allocator<int>> *)&list_10,
             (const_iterator)
             list_10.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             list4.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      list4.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  immutable::operator+((immutable *)&v3,&vec1,&vec2);
  immutable::operator+((immutable *)&v,&v3,&vec3);
  immutable::operator+((immutable *)&vec_11,&v,&vec4);
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&v._impl);
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&v3._impl);
  piVar18 = list_10.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start;
  v = vec_11;
  if (vec_11._impl.ptr != (rrb<int,_false,_6> *)0x0) {
    *(int *)((long)vec_11._impl.ptr + 0x20) = *(int *)((long)vec_11._impl.ptr + 0x20) + 1;
  }
  local_1c8 = (rrb<int,_false,_6> *)((ulong)local_1c8 & 0xffffffff00000000);
  local_1c0.super__Tuple_impl<2UL,_unsigned_int>.super__Head_base<2UL,_unsigned_int,_false>.
  _M_head_impl = (_Head_base<2UL,_unsigned_int,_false>)0xffffffff;
  local_1c0.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl = 0xffffffff;
  local_1b8._M_head_impl = (int *)0x0;
  immutable::vector_iterator<int,_false,_6>::vector_iterator
            ((vector_iterator<int,_false,_6> *)&v3,&vec_11);
  sVar2 = 0;
  while ((sVar2 != local_2c0 || (vec_11._impl.ptr != v3._impl.ptr))) {
    piVar7 = immutable::vector_iterator<int,_false,_6>::operator*
                       ((vector_iterator<int,_false,_6> *)&v);
    TestEq<int,int>(*piVar7,*piVar18,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                    ,0x192,
                    "void (anonymous namespace)::test_iterator_2(uint32_t) [atomic_ref_counting = false, N = 6]"
                   );
    sVar2 = (size_type_conflict)local_1c8 + 1;
    local_1c8 = (rrb<int,_false,_6> *)CONCAT44(local_1c8._4_4_,sVar2);
    piVar18 = piVar18 + 1;
    vec_11 = v;
  }
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&v3._impl);
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&v._impl);
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&vec_11._impl);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&list_10.super__Vector_base<int,_std::allocator<int>_>);
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&vec4._impl);
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&vec3._impl);
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&vec2._impl);
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&vec1._impl);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&list4.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&old_vec);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&vec_5);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&lookups);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&lookups,10000,(allocator_type *)&v);
  puVar19 = lookups.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (puVar20 = lookups.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start; puVar20 != puVar19; puVar20 = puVar20 + 1) {
    uVar15 = rand();
    *puVar20 = uVar15;
  }
  immutable::rrb_create<int,false,6>();
  for (lVar24 = 0; lVar24 != 10000; lVar24 = lVar24 + 1) {
    immutable::vector<int,_false,_6>::push_back(&v,(value_type_conflict)&vec_5);
    immutable::ref<immutable::rrb<int,_false,_6>_>::operator=(&vec_5._impl,&v._impl);
    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&v._impl);
  }
  std::vector<int,_std::allocator<int>_>::erase
            ((vector<int,_std::allocator<int>_> *)&lookups,
             (const_iterator)
             (lookups.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start + 0x9c4),
             (const_iterator)
             (lookups.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start + 5000));
  immutable::vector<int,_false,_6>::erase(&v,(size_type_conflict)&vec_5,0x9c4);
  immutable::ref<immutable::rrb<int,_false,_6>_>::operator=(&vec_5._impl,&v._impl);
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&v._impl);
  vVar13 = vec_5;
  puVar19 = lookups.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start;
  v = vec_5;
  if (vec_5._impl.ptr != (rrb<int,_false,_6> *)0x0) {
    *(int *)((long)vec_5._impl.ptr + 0x20) = *(int *)((long)vec_5._impl.ptr + 0x20) + 1;
  }
  local_1c8 = (rrb<int,_false,_6> *)((ulong)local_1c8 & 0xffffffff00000000);
  local_1c0.super__Tuple_impl<2UL,_unsigned_int>.super__Head_base<2UL,_unsigned_int,_false>.
  _M_head_impl = (_Head_base<2UL,_unsigned_int,_false>)0xffffffff;
  local_1c0.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl = 0xffffffff;
  local_1b8._M_head_impl = (int *)0x0;
  immutable::vector_iterator<int,_false,_6>::vector_iterator
            ((vector_iterator<int,_false,_6> *)&v3,&vec_5);
  sVar2 = 0;
  while ((sVar2 != local_2c0 || (vVar13._impl.ptr != v3._impl.ptr))) {
    piVar7 = immutable::vector_iterator<int,_false,_6>::operator*
                       ((vector_iterator<int,_false,_6> *)&v);
    TestEq<int,int>(*piVar7,*puVar19,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                    ,0x1ae,
                    "void (anonymous namespace)::test_iterator_3(uint32_t) [atomic_ref_counting = false, N = 6]"
                   );
    sVar2 = (size_type_conflict)local_1c8 + 1;
    local_1c8 = (rrb<int,_false,_6> *)CONCAT44(local_1c8._4_4_,sVar2);
    puVar19 = puVar19 + 1;
    vVar13 = v;
  }
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&v3._impl);
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&v._impl);
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&vec_5._impl);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&lookups);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&lookups,10000,(allocator_type *)&v);
  puVar19 = lookups.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (puVar20 = lookups.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start; puVar20 != puVar19; puVar20 = puVar20 + 1) {
    uVar15 = rand();
    *puVar20 = uVar15;
  }
  immutable::rrb_create<int,false,6>();
  for (lVar24 = 0;
      puVar19 = lookups.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish, lVar24 != 10000; lVar24 = lVar24 + 1) {
    immutable::vector<int,_false,_6>::push_back(&v,(value_type_conflict)&vec_5);
    immutable::ref<immutable::rrb<int,_false,_6>_>::operator=(&vec_5._impl,&v._impl);
    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&v._impl);
  }
  immutable::vector<int,_false,_6>::rbegin((reverse_iterator *)&v,&vec_5);
  immutable::vector<int,_false,_6>::rend((reverse_iterator *)&v3,&vec_5);
  while( true ) {
    puVar19 = puVar19 + -1;
    bVar1 = std::operator!=((reverse_iterator<immutable::vector_iterator<int,_false,_6>_> *)&v,
                            (reverse_iterator<immutable::vector_iterator<int,_false,_6>_> *)&v3);
    if (!bVar1) break;
    piVar8 = std::reverse_iterator<immutable::vector_iterator<int,_false,_6>_>::operator*
                       ((reverse_iterator<immutable::vector_iterator<int,_false,_6>_> *)&v);
    TestEq<int,int>(*piVar8,*puVar19,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                    ,0x1c7,
                    "void (anonymous namespace)::test_reverse_iterator(uint32_t) [atomic_ref_counting = false, N = 6]"
                   );
    local_1c8 = (rrb<int,_false,_6> *)CONCAT44(local_1c8._4_4_,(size_type_conflict)local_1c8 - 1);
  }
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&v3._impl);
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&v._impl);
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&vec_5._impl);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&lookups);
  immutable::rrb_create<int,false,6>();
  v3 = v;
  if (v._impl.ptr != (rrb<int,_false,_6> *)0x0) {
    *(int *)((long)v._impl.ptr + 0x20) = *(int *)((long)v._impl.ptr + 0x20) + 1;
  }
  bVar1 = immutable::vector<int,_false,_6>::operator==(&v,&v3);
  TestEq<bool,bool>(true,bVar1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                    ,0x1d0,
                    "void (anonymous namespace)::test_vector_equality() [atomic_ref_counting = false, N = 6]"
                   );
  immutable::vector<int,_false,_6>::push_back
            ((vector<int,_false,_6> *)&lookups,(value_type_conflict)&v);
  immutable::vector<int,_false,_6>::push_back(&vec_5,(value_type_conflict)&v);
  bVar1 = immutable::vector<int,_false,_6>::operator==((vector<int,_false,_6> *)&lookups,&vec_5);
  TestEq<bool,bool>(true,bVar1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                    ,0x1d3,
                    "void (anonymous namespace)::test_vector_equality() [atomic_ref_counting = false, N = 6]"
                   );
  old_vec._impl.ptr =
       (ref<immutable::rrb<int,_false,_6>_>)
       (ref<immutable::rrb<int,_false,_6>_>)
       lookups.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  if (lookups.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    lookups.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[8] =
         lookups.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start[8] + 1;
  }
  bVar1 = immutable::vector<int,_false,_6>::operator==(&old_vec,(vector<int,_false,_6> *)&lookups);
  TestEq<bool,bool>(true,bVar1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                    ,0x1d5,
                    "void (anonymous namespace)::test_vector_equality() [atomic_ref_counting = false, N = 6]"
                   );
  bVar1 = immutable::vector<int,_false,_6>::operator==(&old_vec,&vec_5);
  TestEq<bool,bool>(true,bVar1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                    ,0x1d6,
                    "void (anonymous namespace)::test_vector_equality() [atomic_ref_counting = false, N = 6]"
                   );
  immutable::rrb_create<int,false,6>();
  bVar1 = immutable::vector<int,_false,_6>::operator==(&v,(vector<int,_false,_6> *)&list4);
  TestEq<bool,bool>(true,bVar1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                    ,0x1d8,
                    "void (anonymous namespace)::test_vector_equality() [atomic_ref_counting = false, N = 6]"
                   );
  immutable::vector<int,_false,_6>::push_back
            ((vector<int,_false,_6> *)&list_10,(value_type_conflict)&v);
  immutable::ref<immutable::rrb<int,_false,_6>_>::operator=
            ((ref<immutable::rrb<int,_false,_6>_> *)&list4,
             (ref<immutable::rrb<int,_false,_6>_> *)&list_10);
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
            ((ref<immutable::rrb<int,_false,_6>_> *)&list_10);
  bVar1 = immutable::vector<int,_false,_6>::operator!=(&v,(vector<int,_false,_6> *)&list4);
  TestEq<bool,bool>(true,bVar1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                    ,0x1da,
                    "void (anonymous namespace)::test_vector_equality() [atomic_ref_counting = false, N = 6]"
                   );
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
            ((ref<immutable::rrb<int,_false,_6>_> *)&list4);
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&old_vec._impl);
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&vec_5._impl);
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
            ((ref<immutable::rrb<int,_false,_6>_> *)&lookups);
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&v3._impl);
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&v._impl);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&v,10,(allocator_type *)&v3);
  for (vVar13 = v; vVar13._impl.ptr != (ref<immutable::rrb<int,_false,_6>_>)local_1c8;
      vVar13._impl.ptr =
           (ref<immutable::rrb<int,_false,_6>_>)&((rrb<int,_false,_6> *)vVar13._impl.ptr)->shift) {
    uVar3 = rand();
    ((rrb<int,_false,_6> *)vVar13._impl.ptr)->cnt = uVar3;
  }
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&v3,10,(allocator_type *)&lookups);
  for (vVar13 = v3; vVar13._impl.ptr != (rrb<int,_false,_6> *)CONCAT44(uStack_2bc,local_2c0);
      vVar13._impl.ptr =
           (ref<immutable::rrb<int,_false,_6>_>)&((rrb<int,_false,_6> *)vVar13._impl.ptr)->shift) {
    uVar3 = rand();
    ((rrb<int,_false,_6> *)vVar13._impl.ptr)->cnt = uVar3;
  }
  immutable::rrb_create<int,false,6>();
  for (lVar24 = 0; lVar24 != 10; lVar24 = lVar24 + 1) {
    immutable::vector<int,_false,_6>::push_back(&vec_5,(value_type_conflict)&lookups);
    immutable::ref<immutable::rrb<int,_false,_6>_>::operator=
              ((ref<immutable::rrb<int,_false,_6>_> *)&lookups,&vec_5._impl);
    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&vec_5._impl);
  }
  immutable::rrb_create<int,false,6>();
  for (lVar24 = 0; lVar24 != 10; lVar24 = lVar24 + 1) {
    immutable::vector<int,_false,_6>::push_back(&old_vec,(value_type_conflict)&vec_5);
    immutable::ref<immutable::rrb<int,_false,_6>_>::operator=(&vec_5._impl,&old_vec._impl);
    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&old_vec._impl);
  }
  __last._M_current._4_4_ = uStack_2bc;
  __last._M_current._0_4_ = local_2c0;
  std::vector<int,std::allocator<int>>::
  insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
            ((vector<int,std::allocator<int>> *)&v,(int *)((long)v._impl.ptr + 0x14),
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)v3._impl.ptr,__last)
  ;
  list4.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)vec_5._impl.ptr;
  if (vec_5._impl.ptr != (rrb<int,_false,_6> *)0x0) {
    *(int *)((long)vec_5._impl.ptr + 0x20) = *(int *)((long)vec_5._impl.ptr + 0x20) + 1;
  }
  immutable::vector<int,_false,_6>::insert
            (&old_vec,(size_type_conflict)&lookups,(vector<int,_false,_6> *)0x5);
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
            ((ref<immutable::rrb<int,_false,_6>_> *)&list4);
  sVar2 = immutable::vector<int,_false,_6>::size(&old_vec);
  TestEq<unsigned_int,unsigned_long>
            (sVar2,(long)local_1c8 - (long)v._impl.ptr >> 2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
             ,0x1f7,
             "void (anonymous namespace)::test_insert_vector(uint32_t) [atomic_ref_counting = false, N = 6]"
            );
  for (uVar15 = 0; (ulong)uVar15 < (ulong)((long)local_1c8 - (long)v._impl.ptr >> 2);
      uVar15 = uVar15 + 1) {
    piVar5 = immutable::rrb_nth<int,false,6>(&old_vec._impl,uVar15);
    TestEq<int,int>(*piVar5,*(int *)((long)v._impl.ptr + (ulong)uVar15 * 4),
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                    ,0x1fa,
                    "void (anonymous namespace)::test_insert_vector(uint32_t) [atomic_ref_counting = false, N = 6]"
                   );
  }
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&old_vec._impl);
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&vec_5._impl);
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
            ((ref<immutable::rrb<int,_false,_6>_> *)&lookups);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&v3);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&v);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&v,13000,(allocator_type *)&v3);
  for (vVar13 = v; vVar13._impl.ptr != (ref<immutable::rrb<int,_false,_6>_>)local_1c8;
      vVar13._impl.ptr =
           (ref<immutable::rrb<int,_false,_6>_>)&((rrb<int,_false,_6> *)vVar13._impl.ptr)->shift) {
    uVar3 = rand();
    ((rrb<int,_false,_6> *)vVar13._impl.ptr)->cnt = uVar3;
  }
  immutable::rrb_create<int,false,6>();
  immutable::transient_vector<int,_false,_6>::transient_vector
            ((transient_vector<int,_false,_6> *)&lookups,&v3._impl);
  lVar24 = 1;
  for (lVar14 = 0; lVar14 != 13000; lVar14 = lVar14 + 1) {
    immutable::transient_vector<int,_false,_6>::push_back
              ((transient_vector<int,_false,_6> *)&lookups,
               *(value_type_conflict *)((long)v._impl.ptr + lVar14 * 4));
    for (lVar16 = 0; lVar24 != lVar16; lVar16 = lVar16 + 1) {
      piVar5 = immutable::transient_rrb_nth<int,false,6>
                         ((ref<immutable::transient_rrb<int,_false,_6>_> *)&lookups,(uint32_t)lVar16
                         );
      TestEq<int,int>(*(int *)((long)v._impl.ptr + lVar16 * 4),*piVar5,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                      ,0x20f,
                      "void (anonymous namespace)::test_transient_vector_push(uint32_t) [atomic_ref_counting = false, N = 6]"
                     );
    }
    lVar24 = lVar24 + 1;
  }
  immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref
            ((ref<immutable::transient_rrb<int,_false,_6>_> *)&lookups);
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&v3._impl);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&v);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&v,400000,(allocator_type *)&v3);
  for (vVar13 = v; vVar13._impl.ptr != (ref<immutable::rrb<int,_false,_6>_>)local_1c8;
      vVar13._impl.ptr =
           (ref<immutable::rrb<int,_false,_6>_>)&((rrb<int,_false,_6> *)vVar13._impl.ptr)->shift) {
    uVar3 = rand();
    ((rrb<int,_false,_6> *)vVar13._impl.ptr)->cnt = uVar3;
  }
  immutable::rrb_create<int,false,6>();
  immutable::transient_vector<int,_false,_6>::transient_vector
            ((transient_vector<int,_false,_6> *)&lookups,&v3._impl);
  for (lVar24 = 0; lVar24 != 400000; lVar24 = lVar24 + 1) {
    immutable::transient_vector<int,_false,_6>::push_back
              ((transient_vector<int,_false,_6> *)&lookups,
               *(value_type_conflict *)((long)v._impl.ptr + lVar24 * 4));
  }
  immutable::vector<int,_false,_6>::vector
            (&vec_5,(ref<immutable::transient_rrb<int,_false,_6>_> *)&lookups);
  immutable::ref<immutable::rrb<int,_false,_6>_>::operator=(&v3._impl,&vec_5._impl);
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&vec_5._impl);
  immutable::transient_vector<int,_false,_6>::transient_vector
            ((transient_vector<int,_false,_6> *)&vec_5,&v3._impl);
  immutable::ref<immutable::transient_rrb<int,_false,_6>_>::operator=
            ((ref<immutable::transient_rrb<int,_false,_6>_> *)&lookups,
             (ref<immutable::transient_rrb<int,_false,_6>_> *)&vec_5);
  immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref
            ((ref<immutable::transient_rrb<int,_false,_6>_> *)&vec_5);
  for (uVar17 = 399999; uVar17 != 0xffffffffffffffff; uVar17 = uVar17 - 1) {
    piVar5 = immutable::transient_rrb_peek<int,false,6>
                       ((ref<immutable::transient_rrb<int,_false,_6>_> *)&lookups);
    TestEq<int,int>(*(int *)((long)v._impl.ptr + (uVar17 & 0xffffffff) * 4),*piVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                    ,0x228,
                    "void (anonymous namespace)::test_transient_vector_pop(uint32_t) [atomic_ref_counting = false, N = 6]"
                   );
    immutable::transient_vector<int,_false,_6>::pop_back
              ((transient_vector<int,_false,_6> *)&lookups);
  }
  immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref
            ((ref<immutable::transient_rrb<int,_false,_6>_> *)&lookups);
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&v3._impl);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&v);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&v,400000,(allocator_type *)&v3);
  for (vVar13 = v; vVar13._impl.ptr != (ref<immutable::rrb<int,_false,_6>_>)local_1c8;
      vVar13._impl.ptr =
           (ref<immutable::rrb<int,_false,_6>_>)&((rrb<int,_false,_6> *)vVar13._impl.ptr)->shift) {
    uVar3 = rand();
    ((rrb<int,_false,_6> *)vVar13._impl.ptr)->cnt = uVar3;
  }
  immutable::rrb_create<int,false,6>();
  immutable::transient_vector<int,_false,_6>::transient_vector
            ((transient_vector<int,_false,_6> *)&old_vec,&vec_5._impl);
  for (lVar24 = 0; lVar24 != 400000; lVar24 = lVar24 + 1) {
    immutable::transient_vector<int,_false,_6>::push_back
              ((transient_vector<int,_false,_6> *)&old_vec,
               *(value_type_conflict *)((long)v._impl.ptr + lVar24 * 4));
  }
  immutable::vector<int,_false,_6>::vector
            (&v3,(ref<immutable::transient_rrb<int,_false,_6>_> *)&old_vec);
  immutable::ref<immutable::rrb<int,_false,_6>_>::operator=(&vec_5._impl,&v3._impl);
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&v3._impl);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&v3,0x208d9,(allocator_type *)&lookups);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&lookups,0x208d9,(allocator_type *)&list4);
  for (lVar24 = 0; lVar24 != 0x208d9; lVar24 = lVar24 + 1) {
    iVar4 = rand();
    *(int *)((long)v3._impl.ptr + lVar24 * 4) = iVar4;
    uVar15 = rand();
    lookups.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[lVar24] = uVar15 % 400000;
  }
  immutable::transient_vector<int,_false,_6>::transient_vector
            ((transient_vector<int,_false,_6> *)&list4,&vec_5._impl);
  immutable::ref<immutable::transient_rrb<int,_false,_6>_>::operator=
            ((ref<immutable::transient_rrb<int,_false,_6>_> *)&old_vec,
             (ref<immutable::transient_rrb<int,_false,_6>_> *)&list4);
  immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref
            ((ref<immutable::transient_rrb<int,_false,_6>_> *)&list4);
  for (lVar24 = 0; lVar24 != 0x208d9; lVar24 = lVar24 + 1) {
    uVar15 = lookups.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[lVar24];
    immutable::transient_vector<int,_false,_6>::set
              ((transient_vector<int,_false,_6> *)&old_vec,uVar15,
               *(value_type_conflict *)((long)v3._impl.ptr + lVar24 * 4));
    piVar5 = immutable::rrb_nth<int,false,6>(&vec_5._impl,uVar15);
    iVar4 = *piVar5;
    piVar5 = immutable::transient_rrb_nth<int,false,6>
                       ((ref<immutable::transient_rrb<int,_false,_6>_> *)&old_vec,uVar15);
    iVar23 = *piVar5;
    TestEq<int,int>(iVar4,*(int *)((long)v._impl.ptr + (ulong)uVar15 * 4),
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                    ,0x24e,
                    "void (anonymous namespace)::test_transient_vector_update(uint32_t, uint32_t) [atomic_ref_counting = false, N = 6]"
                   );
    TestEq<int,int>(iVar23,*(int *)((long)v3._impl.ptr + lVar24 * 4),
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                    ,0x24f,
                    "void (anonymous namespace)::test_transient_vector_update(uint32_t, uint32_t) [atomic_ref_counting = false, N = 6]"
                   );
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&lookups.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&v3);
  immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref
            ((ref<immutable::transient_rrb<int,_false,_6>_> *)&old_vec);
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&vec_5._impl);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&v);
  uVar17 = 0;
  while ((int)uVar17 != 400) {
    local_38 = uVar17;
    uVar15 = rand();
    uVar11 = uVar15 % 0x32 + 0x20;
    uVar22 = (ulong)uVar11;
    uVar15 = rand();
    uVar17 = 0x28 % (ulong)uVar15;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&v,uVar17,(allocator_type *)&v3);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&v3,uVar22,(allocator_type *)&lookups);
    for (uVar25 = 0; uVar25 < uVar17; uVar25 = uVar25 + 1) {
      iVar4 = rand();
      *(int *)((long)v._impl.ptr + uVar25 * 4) = iVar4 % 0x1000;
    }
    for (uVar25 = 0; uVar15 = rand(), uVar22 != uVar25; uVar25 = uVar25 + 1) {
      *(int *)((long)v3._impl.ptr + uVar25 * 4) = (int)uVar15 % 0x1000;
    }
    immutable::rrb_create<int,false,6>();
    immutable::rrb_create<int,false,6>();
    immutable::transient_vector<int,_false,_6>::transient_vector
              ((transient_vector<int,_false,_6> *)&old_vec,
               (ref<immutable::rrb<int,_false,_6>_> *)&lookups);
    iVar4 = (int)((ulong)uVar15 % uVar17);
    for (uVar25 = 0; uVar25 < (ulong)uVar15 % uVar17; uVar25 = uVar25 + 1) {
      immutable::transient_vector<int,_false,_6>::push_back
                ((transient_vector<int,_false,_6> *)&old_vec,
                 *(value_type_conflict *)((long)v._impl.ptr + uVar25 * 4));
    }
    immutable::vector<int,_false,_6>::vector
              ((vector<int,_false,_6> *)&list4,
               (ref<immutable::transient_rrb<int,_false,_6>_> *)&old_vec);
    immutable::ref<immutable::rrb<int,_false,_6>_>::operator=
              ((ref<immutable::rrb<int,_false,_6>_> *)&lookups,
               (ref<immutable::rrb<int,_false,_6>_> *)&list4);
    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
              ((ref<immutable::rrb<int,_false,_6>_> *)&list4);
    immutable::transient_vector<int,_false,_6>::transient_vector
              ((transient_vector<int,_false,_6> *)&list4,&vec_5._impl);
    immutable::ref<immutable::transient_rrb<int,_false,_6>_>::operator=
              ((ref<immutable::transient_rrb<int,_false,_6>_> *)&old_vec,
               (ref<immutable::transient_rrb<int,_false,_6>_> *)&list4);
    immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref
              ((ref<immutable::transient_rrb<int,_false,_6>_> *)&list4);
    iVar23 = (int)uVar17;
    for (uVar25 = 0; uVar25 < (uint)(iVar23 - iVar4); uVar25 = uVar25 + 1) {
      immutable::transient_vector<int,_false,_6>::push_back
                ((transient_vector<int,_false,_6> *)&old_vec,
                 *(value_type_conflict *)
                  ((long)v._impl.ptr + (ulong)(uint)(iVar4 + (int)uVar25) * 4));
    }
    immutable::vector<int,_false,_6>::vector
              ((vector<int,_false,_6> *)&list4,
               (ref<immutable::transient_rrb<int,_false,_6>_> *)&old_vec);
    immutable::ref<immutable::rrb<int,_false,_6>_>::operator=
              (&vec_5._impl,(ref<immutable::rrb<int,_false,_6>_> *)&list4);
    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
              ((ref<immutable::rrb<int,_false,_6>_> *)&list4);
    immutable::operator+((immutable *)&list4,(vector<int,_false,_6> *)&lookups,&vec_5);
    immutable::transient_vector<int,_false,_6>::transient_vector
              ((transient_vector<int,_false,_6> *)&list_10,
               (ref<immutable::rrb<int,_false,_6>_> *)&list4);
    for (uVar25 = 0; uVar22 != uVar25; uVar25 = uVar25 + 1) {
      immutable::transient_vector<int,_false,_6>::push_back
                ((transient_vector<int,_false,_6> *)&list_10,
                 *(value_type_conflict *)((long)v3._impl.ptr + uVar25 * 4));
    }
    sVar2 = immutable::transient_vector<int,_false,_6>::size
                      ((transient_vector<int,_false,_6> *)&list_10);
    TestEq<unsigned_int,unsigned_int>
              (uVar11 + iVar23,sVar2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
               ,0x281,
               "void (anonymous namespace)::test_transient_vector_push_2(uint32_t, uint32_t, uint32_t) [atomic_ref_counting = false, N = 6]"
              );
    for (uVar25 = 0; uVar25 < uVar17; uVar25 = uVar25 + 1) {
      piVar5 = immutable::transient_rrb_nth<int,false,6>
                         ((ref<immutable::transient_rrb<int,_false,_6>_> *)&list_10,(uint32_t)uVar25
                         );
      iVar4 = *piVar5;
      piVar5 = immutable::rrb_nth<int,false,6>
                         ((ref<immutable::rrb<int,_false,_6>_> *)&list4,(uint32_t)uVar25);
      expval = *piVar5;
      TestEq<int,int>(*(int *)((long)v._impl.ptr + uVar25 * 4),iVar4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                      ,0x288,
                      "void (anonymous namespace)::test_transient_vector_push_2(uint32_t, uint32_t, uint32_t) [atomic_ref_counting = false, N = 6]"
                     );
      TestEq<int,int>(expval,iVar4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                      ,0x289,
                      "void (anonymous namespace)::test_transient_vector_push_2(uint32_t, uint32_t, uint32_t) [atomic_ref_counting = false, N = 6]"
                     );
    }
    for (uVar25 = 0; uVar22 != uVar25; uVar25 = uVar25 + 1) {
      piVar5 = immutable::transient_rrb_nth<int,false,6>
                         ((ref<immutable::transient_rrb<int,_false,_6>_> *)&list_10,
                          (int)uVar25 + iVar23);
      TestEq<int,int>(*(int *)((long)v3._impl.ptr + uVar25 * 4),*piVar5,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                      ,0x290,
                      "void (anonymous namespace)::test_transient_vector_push_2(uint32_t, uint32_t, uint32_t) [atomic_ref_counting = false, N = 6]"
                     );
    }
    immutable::vector<int,_false,_6>::vector
              (&vec1,(ref<immutable::transient_rrb<int,_false,_6>_> *)&list_10);
    uVar15 = rand();
    rand();
    immutable::vector<int,_false,_6>::take(&vec3,(size_type_conflict)&list4);
    immutable::vector<int,_false,_6>::drop
              (&vec2,(size_type_conflict)(transient_vector<int,_false,_6> *)&vec3);
    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
              ((ref<immutable::rrb<int,_false,_6>_> *)&vec3);
    immutable::transient_vector<int,_false,_6>::transient_vector
              ((transient_vector<int,_false,_6> *)&vec3,&vec2._impl);
    immutable::ref<immutable::transient_rrb<int,_false,_6>_>::operator=
              ((ref<immutable::transient_rrb<int,_false,_6>_> *)&list_10,
               (ref<immutable::transient_rrb<int,_false,_6>_> *)&vec3);
    immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref
              ((ref<immutable::transient_rrb<int,_false,_6>_> *)&vec3);
    for (uVar25 = 0; uVar22 != uVar25; uVar25 = uVar25 + 1) {
      immutable::transient_vector<int,_false,_6>::push_back
                ((transient_vector<int,_false,_6> *)&list_10,
                 *(value_type_conflict *)((long)v3._impl.ptr + uVar25 * 4));
    }
    uVar25 = 0;
    while( true ) {
      sVar2 = immutable::vector<int,_false,_6>::size(&vec2);
      if (sVar2 <= uVar25) break;
      uVar3 = (uint32_t)uVar25;
      piVar5 = immutable::transient_rrb_nth<int,false,6>
                         ((ref<immutable::transient_rrb<int,_false,_6>_> *)&list_10,uVar3);
      iVar4 = *piVar5;
      piVar5 = immutable::rrb_nth<int,false,6>(&vec2._impl,uVar3);
      iVar23 = *piVar5;
      TestEq<int,int>(*(int *)((long)v._impl.ptr +
                              (ulong)((int)((ulong)uVar15 % uVar17) + uVar3) * 4),iVar4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                      ,0x2a6,
                      "void (anonymous namespace)::test_transient_vector_push_2(uint32_t, uint32_t, uint32_t) [atomic_ref_counting = false, N = 6]"
                     );
      TestEq<int,int>(iVar23,iVar4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                      ,0x2a7,
                      "void (anonymous namespace)::test_transient_vector_push_2(uint32_t, uint32_t, uint32_t) [atomic_ref_counting = false, N = 6]"
                     );
      uVar25 = uVar25 + 1;
    }
    for (uVar17 = 0; uVar22 != uVar17; uVar17 = uVar17 + 1) {
      sVar2 = immutable::vector<int,_false,_6>::size(&vec2);
      piVar5 = immutable::transient_rrb_nth<int,false,6>
                         ((ref<immutable::transient_rrb<int,_false,_6>_> *)&list_10,
                          sVar2 + (int)uVar17);
      TestEq<int,int>(*(int *)((long)v3._impl.ptr + uVar17 * 4),*piVar5,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                      ,0x2ae,
                      "void (anonymous namespace)::test_transient_vector_push_2(uint32_t, uint32_t, uint32_t) [atomic_ref_counting = false, N = 6]"
                     );
    }
    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&vec2._impl);
    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&vec1._impl);
    immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref
              ((ref<immutable::transient_rrb<int,_false,_6>_> *)&list_10);
    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
              ((ref<immutable::rrb<int,_false,_6>_> *)&list4);
    immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref
              ((ref<immutable::transient_rrb<int,_false,_6>_> *)&old_vec);
    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&vec_5._impl);
    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
              ((ref<immutable::rrb<int,_false,_6>_> *)&lookups);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&v3);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&v);
    uVar17 = (ulong)((int)local_38 + 1);
  }
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&lookups,10000,(allocator_type *)&v);
  puVar19 = lookups.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (puVar20 = lookups.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start; puVar20 != puVar19; puVar20 = puVar20 + 1) {
    uVar15 = rand();
    *puVar20 = uVar15;
  }
  immutable::rrb_create<int,false,6>();
  for (lVar24 = 0; lVar24 != 10000; lVar24 = lVar24 + 1) {
    immutable::vector<int,_false,_6>::push_back(&v,(value_type_conflict)&vec_5);
    immutable::ref<immutable::rrb<int,_false,_6>_>::operator=(&vec_5._impl,&v._impl);
    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&v._impl);
  }
  immutable::transient_vector<int,_false,_6>::transient_vector
            ((transient_vector<int,_false,_6> *)&old_vec,&vec_5._impl);
  puVar19 = lookups.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start;
  immutable::transient_vector<int,_false,_6>::begin
            ((iterator *)&v,(transient_vector<int,_false,_6> *)&old_vec);
  immutable::transient_vector<int,_false,_6>::end
            ((iterator *)&v3,(transient_vector<int,_false,_6> *)&old_vec);
  sVar2 = (size_type_conflict)local_1c8;
  while ((sVar2 != local_2c0 || (v._impl.ptr != v3._impl.ptr))) {
    piVar7 = immutable::vector_iterator<int,_false,_6>::operator*
                       ((vector_iterator<int,_false,_6> *)&v);
    TestEq<int,int>(*piVar7,*puVar19,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                    ,0x2ca,
                    "void (anonymous namespace)::test_transient_iterator(uint32_t) [atomic_ref_counting = false, N = 6]"
                   );
    sVar2 = (size_type_conflict)local_1c8 + 1;
    local_1c8 = (rrb<int,_false,_6> *)CONCAT44(local_1c8._4_4_,sVar2);
    puVar19 = puVar19 + 1;
  }
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&v3._impl);
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&v._impl);
  immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref
            ((ref<immutable::transient_rrb<int,_false,_6>_> *)&old_vec);
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&vec_5._impl);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&lookups);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&lookups,1000,(allocator_type *)&v);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&vec_5,1000,(allocator_type *)&v);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&old_vec,1000,(allocator_type *)&v);
  std::vector<int,_std::allocator<int>_>::vector(&list4,1000,(allocator_type *)&v);
  puVar19 = lookups.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (puVar20 = lookups.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start; puVar20 != puVar19; puVar20 = puVar20 + 1) {
    uVar15 = rand();
    *puVar20 = uVar15;
  }
  for (vVar13._impl.ptr = vec_5._impl.ptr;
      vVar13._impl.ptr != (rrb<int,_false,_6> *)CONCAT44(uStack_27c,local_280);
      vVar13._impl.ptr =
           (ref<immutable::rrb<int,_false,_6>_>)&((rrb<int,_false,_6> *)vVar13._impl.ptr)->shift) {
    uVar3 = rand();
    ((rrb<int,_false,_6> *)vVar13._impl.ptr)->cnt = uVar3;
  }
  for (vVar13._impl.ptr = old_vec._impl.ptr;
      piVar18 = list4.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish,
      piVar5 = list4.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start, vVar13._impl.ptr != (rrb<int,_false,_6> *)CONCAT44(uStack_234,local_238);
      vVar13._impl.ptr =
           (ref<immutable::rrb<int,_false,_6>_>)&((rrb<int,_false,_6> *)vVar13._impl.ptr)->shift) {
    uVar3 = rand();
    ((rrb<int,_false,_6> *)vVar13._impl.ptr)->cnt = uVar3;
  }
  for (; piVar5 != piVar18; piVar5 = piVar5 + 1) {
    iVar4 = rand();
    *piVar5 = iVar4;
  }
  immutable::rrb_create<int,false,6>();
  immutable::rrb_create<int,false,6>();
  immutable::rrb_create<int,false,6>();
  immutable::rrb_create<int,false,6>();
  for (lVar24 = 0; lVar24 != 1000; lVar24 = lVar24 + 1) {
    immutable::vector<int,_false,_6>::push_back(&v,(value_type_conflict)&vec1);
    immutable::ref<immutable::rrb<int,_false,_6>_>::operator=(&vec1._impl,&v._impl);
    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&v._impl);
    immutable::vector<int,_false,_6>::push_back(&v,(value_type_conflict)&vec2);
    immutable::ref<immutable::rrb<int,_false,_6>_>::operator=(&vec2._impl,&v._impl);
    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&v._impl);
    immutable::vector<int,_false,_6>::push_back(&v,(value_type_conflict)&vec3);
    immutable::ref<immutable::rrb<int,_false,_6>_>::operator=(&vec3._impl,&v._impl);
    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&v._impl);
    immutable::vector<int,_false,_6>::push_back(&v,(value_type_conflict)&vec4);
    immutable::ref<immutable::rrb<int,_false,_6>_>::operator=(&vec4._impl,&v._impl);
    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&v._impl);
  }
  list_10.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  list_10.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  list_10.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  std::vector<int,std::allocator<int>>::
  insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
            ((vector<int,std::allocator<int>> *)&list_10,(const_iterator)0x0,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             lookups.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             lookups.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish);
  __last_01._M_current._4_4_ = uStack_27c;
  __last_01._M_current._0_4_ = local_280;
  std::vector<int,std::allocator<int>>::
  insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
            ((vector<int,std::allocator<int>> *)&list_10,
             (const_iterator)
             list_10.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)vec_5._impl.ptr,
             __last_01);
  __last_03._M_current._4_4_ = uStack_234;
  __last_03._M_current._0_4_ = local_238;
  std::vector<int,std::allocator<int>>::
  insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
            ((vector<int,std::allocator<int>> *)&list_10,
             (const_iterator)
             list_10.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)old_vec._impl.ptr,
             __last_03);
  std::vector<int,std::allocator<int>>::
  insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
            ((vector<int,std::allocator<int>> *)&list_10,
             (const_iterator)
             list_10.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             list4.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      list4.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  immutable::operator+((immutable *)&v3,&vec1,&vec2);
  immutable::operator+((immutable *)&v,&v3,&vec3);
  immutable::operator+((immutable *)&vec_11,&v,&vec4);
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&v._impl);
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&v3._impl);
  immutable::transient_vector<int,_false,_6>::transient_vector(&tvec_3,&vec_11._impl);
  piVar18 = list_10.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start;
  immutable::transient_vector<int,_false,_6>::begin((iterator *)&v,&tvec_3);
  immutable::transient_vector<int,_false,_6>::end((iterator *)&v3,&tvec_3);
  sVar2 = (size_type_conflict)local_1c8;
  while ((sVar2 != local_2c0 || (v._impl.ptr != v3._impl.ptr))) {
    piVar7 = immutable::vector_iterator<int,_false,_6>::operator*
                       ((vector_iterator<int,_false,_6> *)&v);
    TestEq<int,int>(*piVar7,*piVar18,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                    ,0x2f6,
                    "void (anonymous namespace)::test_transient_iterator_2(uint32_t) [atomic_ref_counting = false, N = 6]"
                   );
    sVar2 = (size_type_conflict)local_1c8 + 1;
    local_1c8 = (rrb<int,_false,_6> *)CONCAT44(local_1c8._4_4_,sVar2);
    piVar18 = piVar18 + 1;
  }
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&v3._impl);
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&v._impl);
  immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref(&tvec_3._impl);
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&vec_11._impl);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&list_10.super__Vector_base<int,_std::allocator<int>_>);
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&vec4._impl);
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&vec3._impl);
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&vec2._impl);
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&vec1._impl);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&list4.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&old_vec);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&vec_5);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&lookups);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&lookups,10000,(allocator_type *)&v);
  puVar19 = lookups.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (puVar20 = lookups.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start; puVar20 != puVar19; puVar20 = puVar20 + 1) {
    uVar15 = rand();
    *puVar20 = uVar15;
  }
  immutable::rrb_create<int,false,6>();
  for (lVar24 = 0; lVar24 != 10000; lVar24 = lVar24 + 1) {
    immutable::vector<int,_false,_6>::push_back(&v,(value_type_conflict)&vec_5);
    immutable::ref<immutable::rrb<int,_false,_6>_>::operator=(&vec_5._impl,&v._impl);
    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&v._impl);
  }
  std::vector<int,_std::allocator<int>_>::erase
            ((vector<int,_std::allocator<int>_> *)&lookups,
             (const_iterator)
             (lookups.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start + 0x9c4),
             (const_iterator)
             (lookups.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start + 5000));
  immutable::vector<int,_false,_6>::erase(&v,(size_type_conflict)&vec_5,0x9c4);
  immutable::ref<immutable::rrb<int,_false,_6>_>::operator=(&vec_5._impl,&v._impl);
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&v._impl);
  immutable::transient_vector<int,_false,_6>::transient_vector
            ((transient_vector<int,_false,_6> *)&old_vec,&vec_5._impl);
  puVar19 = lookups.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start;
  immutable::transient_vector<int,_false,_6>::begin
            ((iterator *)&v,(transient_vector<int,_false,_6> *)&old_vec);
  immutable::transient_vector<int,_false,_6>::end
            ((iterator *)&v3,(transient_vector<int,_false,_6> *)&old_vec);
  sVar2 = (size_type_conflict)local_1c8;
  while ((sVar2 != local_2c0 || (v._impl.ptr != v3._impl.ptr))) {
    piVar7 = immutable::vector_iterator<int,_false,_6>::operator*
                       ((vector_iterator<int,_false,_6> *)&v);
    TestEq<int,int>(*piVar7,*puVar19,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                    ,0x314,
                    "void (anonymous namespace)::test_transient_iterator_3(uint32_t) [atomic_ref_counting = false, N = 6]"
                   );
    sVar2 = (size_type_conflict)local_1c8 + 1;
    local_1c8 = (rrb<int,_false,_6> *)CONCAT44(local_1c8._4_4_,sVar2);
    puVar19 = puVar19 + 1;
  }
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&v3._impl);
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&v._impl);
  immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref
            ((ref<immutable::transient_rrb<int,_false,_6>_> *)&old_vec);
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&vec_5._impl);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&lookups);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&lookups,10000,(allocator_type *)&v);
  puVar19 = lookups.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (puVar20 = lookups.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start; puVar20 != puVar19; puVar20 = puVar20 + 1) {
    uVar15 = rand();
    *puVar20 = uVar15;
  }
  immutable::rrb_create<int,false,6>();
  for (lVar24 = 0; lVar24 != 10000; lVar24 = lVar24 + 1) {
    immutable::vector<int,_false,_6>::push_back(&v,(value_type_conflict)&vec_5);
    immutable::ref<immutable::rrb<int,_false,_6>_>::operator=(&vec_5._impl,&v._impl);
    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&v._impl);
  }
  immutable::transient_vector<int,_false,_6>::transient_vector
            ((transient_vector<int,_false,_6> *)&old_vec,&vec_5._impl);
  puVar19 = lookups.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish;
  immutable::transient_vector<int,_false,_6>::rbegin
            ((reverse_iterator *)&v,(transient_vector<int,_false,_6> *)&old_vec);
  immutable::transient_vector<int,_false,_6>::rend
            ((reverse_iterator *)&v3,(transient_vector<int,_false,_6> *)&old_vec);
  while( true ) {
    puVar19 = puVar19 + -1;
    bVar1 = std::operator!=((reverse_iterator<immutable::vector_iterator<int,_false,_6>_> *)&v,
                            (reverse_iterator<immutable::vector_iterator<int,_false,_6>_> *)&v3);
    if (!bVar1) break;
    piVar8 = std::reverse_iterator<immutable::vector_iterator<int,_false,_6>_>::operator*
                       ((reverse_iterator<immutable::vector_iterator<int,_false,_6>_> *)&v);
    TestEq<int,int>(*piVar8,*puVar19,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                    ,0x32f,
                    "void (anonymous namespace)::test_transient_reverse_iterator(uint32_t) [atomic_ref_counting = false, N = 6]"
                   );
    local_1c8 = (rrb<int,_false,_6> *)((ulong)local_1c8 & 0xffffffff00000000);
  }
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&v3._impl);
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&v._impl);
  immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref
            ((ref<immutable::transient_rrb<int,_false,_6>_> *)&old_vec);
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&vec_5._impl);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&lookups);
  immutable::rrb_create<int,false,6>();
  iVar4 = 400;
  while (bVar1 = iVar4 != 0, iVar4 = iVar4 + -1, bVar1) {
    rand();
    immutable::vector<int,_false,_6>::push_back(&v,(value_type_conflict)&vec_5);
    immutable::ref<immutable::rrb<int,_false,_6>_>::operator=(&vec_5._impl,&v._impl);
    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&v._impl);
  }
  std::vector<immutable::vector<int,_false,_6>,_std::allocator<immutable::vector<int,_false,_6>_>_>
  ::vector((vector<immutable::vector<int,_false,_6>,_std::allocator<immutable::vector<int,_false,_6>_>_>
            *)&v,0x35,(allocator_type *)&v3);
  for (lVar24 = 0; lVar24 != 0x1a8; lVar24 = lVar24 + 8) {
    rand();
    rand();
    immutable::vector<int,_false,_6>::take
              ((vector<int,_false,_6> *)&lookups,(size_type_conflict)&vec_5);
    immutable::vector<int,_false,_6>::drop(&v3,(size_type_conflict)&lookups);
    immutable::ref<immutable::rrb<int,_false,_6>_>::operator=
              ((ref<immutable::rrb<int,_false,_6>_> *)((long)v._impl.ptr + lVar24),&v3._impl);
    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&v3._impl);
    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
              ((ref<immutable::rrb<int,_false,_6>_> *)&lookups);
  }
  for (iVar4 = 0; iVar4 != 0x906; iVar4 = iVar4 + 1) {
    uVar15 = rand();
    immutable::rrb_create<int,false,6>();
    uVar17 = (ulong)uVar15 % 10;
    std::
    vector<immutable::vector<int,_false,_6>,_std::allocator<immutable::vector<int,_false,_6>_>_>::
    vector((vector<immutable::vector<int,_false,_6>,_std::allocator<immutable::vector<int,_false,_6>_>_>
            *)&v3,uVar17,(allocator_type *)&lookups);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&lookups,uVar17,(allocator_type *)&list4);
    lVar24 = 0;
    for (uVar22 = 0; uVar17 != uVar22; uVar22 = uVar22 + 1) {
      uVar15 = rand();
      lookups.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar22] = uVar15 % 0x35;
      immutable::operator+
                ((immutable *)&list4,&old_vec,
                 (vector<int,_false,_6> *)((ulong)(uVar15 % 0x35 << 3) + (long)v._impl.ptr));
      immutable::ref<immutable::rrb<int,_false,_6>_>::operator=
                (&old_vec._impl,(ref<immutable::rrb<int,_false,_6>_> *)&list4);
      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                ((ref<immutable::rrb<int,_false,_6>_> *)&list4);
      immutable::ref<immutable::rrb<int,_false,_6>_>::operator=
                ((ref<immutable::rrb<int,_false,_6>_> *)((long)v3._impl.ptr + lVar24),&old_vec._impl
                );
      lVar24 = lVar24 + 8;
    }
    local_200 = 0;
    uVar15 = 0;
    while( true ) {
      sVar2 = immutable::vector<int,_false,_6>::size(&old_vec);
      if (sVar2 <= uVar15) break;
      list4.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
           *(pointer *)
            ((long)v._impl.ptr +
            (ulong)lookups.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start[local_200] * 8);
      if (list4.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        list4.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        [8] = list4.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start[8] + 1;
      }
      uVar11 = 0;
      while( true ) {
        sVar2 = immutable::vector<int,_false,_6>::size((vector<int,_false,_6> *)&list4);
        if (sVar2 <= uVar11) break;
        piVar5 = immutable::rrb_nth<int,false,6>
                           ((ref<immutable::rrb<int,_false,_6>_> *)&list4,uVar11);
        iVar23 = *piVar5;
        piVar5 = immutable::rrb_nth<int,false,6>(&old_vec._impl,uVar11 + uVar15);
        TestEq<int,int>(iVar23,*piVar5,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                        ,0x35b,
                        "void (anonymous namespace)::test_catslice(uint32_t, uint32_t, uint32_t, uint32_t) [atomic_ref_counting = false, N = 6]"
                       );
        uVar11 = uVar11 + 1;
      }
      local_200 = (ulong)((int)local_200 + 1);
      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                ((ref<immutable::rrb<int,_false,_6>_> *)&list4);
      uVar15 = uVar11 + uVar15;
    }
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&lookups.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    std::
    vector<immutable::vector<int,_false,_6>,_std::allocator<immutable::vector<int,_false,_6>_>_>::
    ~vector((vector<immutable::vector<int,_false,_6>,_std::allocator<immutable::vector<int,_false,_6>_>_>
             *)&v3);
    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&old_vec._impl);
  }
  std::vector<immutable::vector<int,_false,_6>,_std::allocator<immutable::vector<int,_false,_6>_>_>
  ::~vector((vector<immutable::vector<int,_false,_6>,_std::allocator<immutable::vector<int,_false,_6>_>_>
             *)&v);
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&vec_5._impl);
  std::vector<immutable::vector<int,_false,_6>,_std::allocator<immutable::vector<int,_false,_6>_>_>
  ::vector((vector<immutable::vector<int,_false,_6>,_std::allocator<immutable::vector<int,_false,_6>_>_>
            *)&v,0xa28,(allocator_type *)&v3);
  for (lVar24 = 0; lVar24 != 200; lVar24 = lVar24 + 1) {
    uVar15 = rand();
    uVar15 = uVar15 & 0xf;
    while (bVar1 = uVar15 != 0, uVar15 = uVar15 - 1, bVar1) {
      iVar4 = (int)v._impl.ptr;
      rand();
      immutable::vector<int,_false,_6>::push_back(&v3,iVar4 + (int)(lVar24 * 8));
      immutable::ref<immutable::rrb<int,_false,_6>_>::operator=
                ((ref<immutable::rrb<int,_false,_6>_> *)((long)v._impl.ptr + lVar24 * 8),&v3._impl);
      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&v3._impl);
    }
  }
  for (lVar24 = 0x640; lVar24 != 0x5140; lVar24 = lVar24 + 8) {
    immutable::operator+
              ((immutable *)&v3,(vector<int,_false,_6> *)((long)v._impl.ptr + lVar24 + -0x640),
               (vector<int,_false,_6> *)((long)v._impl.ptr + lVar24 + -0x638));
    immutable::ref<immutable::rrb<int,_false,_6>_>::operator=
              ((ref<immutable::rrb<int,_false,_6>_> *)((long)v._impl.ptr + lVar24),&v3._impl);
    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&v3._impl);
  }
  for (lVar24 = 200; lVar24 != 0xa28; lVar24 = lVar24 + 1) {
    v3._impl.ptr = *(ref<immutable::rrb<int,_false,_6>_> *)((long)v._impl.ptr + lVar24 * 8);
    if (v3._impl.ptr != (rrb<int,_false,_6> *)0x0) {
      ((rrb<int,_false,_6> *)v3._impl.ptr)->_ref_count =
           ((rrb<int,_false,_6> *)v3._impl.ptr)->_ref_count + 1;
    }
    lookups.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = *(pointer *)((long)v._impl.ptr + -0x640 + lVar24 * 8);
    if (lookups.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      lookups.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[8] =
           lookups.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start[8] + 1;
    }
    vec_5._impl.ptr =
         *(ref<immutable::rrb<int,_false,_6>_> *)((long)v._impl.ptr + -0x638 + lVar24 * 8);
    if (vec_5._impl.ptr != (rrb<int,_false,_6> *)0x0) {
      ((rrb<int,_false,_6> *)vec_5._impl.ptr)->_ref_count =
           ((rrb<int,_false,_6> *)vec_5._impl.ptr)->_ref_count + 1;
    }
    for (uVar15 = 0;
        sVar2 = immutable::vector<int,_false,_6>::size((vector<int,_false,_6> *)&lookups),
        uVar15 < sVar2; uVar15 = uVar15 + 1) {
      piVar5 = immutable::rrb_nth<int,false,6>
                         ((ref<immutable::rrb<int,_false,_6>_> *)&lookups,uVar15);
      iVar4 = *piVar5;
      piVar5 = immutable::rrb_nth<int,false,6>(&v3._impl,uVar15);
      TestEq<int,int>(iVar4,*piVar5,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                      ,0x37e,
                      "void (anonymous namespace)::test_fibocat(uint32_t, uint32_t) [atomic_ref_counting = false, N = 6]"
                     );
    }
    for (uVar3 = 0; sVar2 = immutable::vector<int,_false,_6>::size(&vec_5), uVar3 < sVar2;
        uVar3 = uVar3 + 1) {
      piVar5 = immutable::rrb_nth<int,false,6>(&vec_5._impl,uVar3);
      iVar4 = *piVar5;
      piVar5 = immutable::rrb_nth<int,false,6>(&v3._impl,uVar3 + uVar15);
      TestEq<int,int>(iVar4,*piVar5,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                      ,0x385,
                      "void (anonymous namespace)::test_fibocat(uint32_t, uint32_t) [atomic_ref_counting = false, N = 6]"
                     );
    }
    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&vec_5._impl);
    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
              ((ref<immutable::rrb<int,_false,_6>_> *)&lookups);
    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&v3._impl);
  }
  std::vector<immutable::vector<int,_false,_6>,_std::allocator<immutable::vector<int,_false,_6>_>_>
  ::~vector((vector<immutable::vector<int,_false,_6>,_std::allocator<immutable::vector<int,_false,_6>_>_>
             *)&v);
  immutable::rrb_create<int,false,6>();
  immutable::transient_vector<int,_false,_6>::transient_vector
            ((transient_vector<int,_false,_6> *)&lookups,&v3._impl);
  immutable::transient_vector<int,_false,_6>::push_back
            ((transient_vector<int,_false,_6> *)&lookups,0);
  immutable::transient_vector<int,_false,_6>::push_back
            ((transient_vector<int,_false,_6> *)&lookups,1);
  immutable::transient_vector<int,_false,_6>::push_back
            ((transient_vector<int,_false,_6> *)&lookups,2);
  immutable::vector<int,_false,_6>::vector
            (&v,(ref<immutable::transient_rrb<int,_false,_6>_> *)&lookups);
  immutable::ref<immutable::rrb<int,_false,_6>_>::operator=(&v3._impl,&v._impl);
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&v._impl);
  immutable::transient_vector<int,_false,_6>::push_back
            ((transient_vector<int,_false,_6> *)&lookups,3);
  TestEq<bool,bool>(true,false,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                    ,0x39c,
                    "void (anonymous namespace)::test_invalid_states() [atomic_ref_counting = false, N = 6]"
                   );
  piVar6 = immutable::vector<int,_false,_6>::at(&v3,0);
  TestEq<int,int>(0,*piVar6,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                  ,0x39d,
                  "void (anonymous namespace)::test_invalid_states() [atomic_ref_counting = false, N = 6]"
                 );
  piVar6 = immutable::vector<int,_false,_6>::at(&v3,1);
  TestEq<int,int>(1,*piVar6,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                  ,0x39e,
                  "void (anonymous namespace)::test_invalid_states() [atomic_ref_counting = false, N = 6]"
                 );
  piVar6 = immutable::vector<int,_false,_6>::at(&v3,2);
  TestEq<int,int>(2,*piVar6,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                  ,0x39f,
                  "void (anonymous namespace)::test_invalid_states() [atomic_ref_counting = false, N = 6]"
                 );
  immutable::vector<int,_false,_6>::at(&v3,3);
  TestEq<bool,bool>(true,false,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                    ,0x3a9,
                    "void (anonymous namespace)::test_invalid_states() [atomic_ref_counting = false, N = 6]"
                   );
  immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref
            ((ref<immutable::transient_rrb<int,_false,_6>_> *)&lookups);
  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref(&v3._impl);
  test_erase<false,6>(10000,0x9c4);
  test_concat<false,6>(2000);
  immutable::rrb_create<char,false,6>();
  immutable::rrb_create<immutable::vector<char,false,6>,true,5>();
  for (iVar4 = 0; iVar4 != 0x1e; iVar4 = iVar4 + 1) {
    iVar23 = 3;
    while (bVar1 = iVar23 != 0, iVar23 = iVar23 + -1, bVar1) {
      immutable::vector<char,_false,_6>::push_back
                ((vector<char,_false,_6> *)&v,(value_type)&lookups);
      immutable::ref<immutable::rrb<char,_false,_6>_>::operator=
                ((ref<immutable::rrb<char,_false,_6>_> *)&lookups,
                 (ref<immutable::rrb<char,_false,_6>_> *)&v);
      immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                ((ref<immutable::rrb<char,_false,_6>_> *)&v);
    }
    old_vec._impl.ptr =
         (ref<immutable::rrb<int,_false,_6>_>)
         (ref<immutable::rrb<int,_false,_6>_>)
         lookups.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start;
    if (lookups.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      lookups.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[8] =
           lookups.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start[8] + 1;
    }
    immutable::vector<immutable::vector<char,_false,_6>,_true,_5>::push_back
              ((vector<immutable::vector<char,_false,_6>,_true,_5> *)&v,(value_type *)&vec_5);
    immutable::ref<immutable::rrb<immutable::vector<char,_false,_6>,_true,_5>_>::operator=
              ((ref<immutable::rrb<immutable::vector<char,_false,_6>,_true,_5>_> *)&vec_5,
               (ref<immutable::rrb<immutable::vector<char,_false,_6>,_true,_5>_> *)&v);
    immutable::ref<immutable::rrb<immutable::vector<char,_false,_6>,_true,_5>_>::~ref
              ((ref<immutable::rrb<immutable::vector<char,_false,_6>,_true,_5>_> *)&v);
    immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
              ((ref<immutable::rrb<char,_false,_6>_> *)&old_vec);
  }
  pvVar9 = immutable::rrb_peek<immutable::vector<char,false,6>,true,5>
                     ((ref<immutable::rrb<immutable::vector<char,_false,_6>,_true,_5>_> *)&vec_5);
  vVar13._impl.ptr = (ref<immutable::rrb<int,_false,_6>_>)(pvVar9->_impl).ptr;
  if (vVar13._impl.ptr != (rrb<int,_false,_6> *)0x0) {
    ((rrb<int,_false,_6> *)vVar13._impl.ptr)->_ref_count =
         ((rrb<int,_false,_6> *)vVar13._impl.ptr)->_ref_count + 1;
  }
  local_1c8 = (rrb<int,_false,_6> *)((ulong)local_1c8 & 0xffffffff00000000);
  local_1c0.super__Tuple_impl<2UL,_unsigned_int>.super__Head_base<2UL,_unsigned_int,_false>.
  _M_head_impl = (_Head_base<2UL,_unsigned_int,_false>)0xffffffff;
  local_1c0.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl = 0xffffffff;
  local_1b8._M_head_impl = (int *)0x0;
  v._impl.ptr = vVar13._impl.ptr;
  immutable::vector_iterator<char,_false,_6>::vector_iterator
            ((vector_iterator<char,_false,_6> *)&v3,pvVar9);
  sVar2 = 0;
  while ((sVar2 != local_2c0 || (vVar13._impl.ptr != v3._impl.ptr))) {
    pcVar10 = immutable::vector_iterator<char,_false,_6>::operator*
                        ((vector_iterator<char,_false,_6> *)&v);
    TestEq<char,char>('a',*pcVar10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                      ,0x3bb,
                      "void (anonymous namespace)::test_vector_of_vector() [atomic_ref_counting = false, N = 6]"
                     );
    sVar2 = (size_type_conflict)local_1c8 + 1;
    local_1c8 = (rrb<int,_false,_6> *)CONCAT44(local_1c8._4_4_,sVar2);
    vVar13 = v;
  }
  immutable::ref<immutable::rrb<char,_false,_6>_>::~ref((ref<immutable::rrb<char,_false,_6>_> *)&v3)
  ;
  immutable::ref<immutable::rrb<char,_false,_6>_>::~ref((ref<immutable::rrb<char,_false,_6>_> *)&v);
  immutable::ref<immutable::rrb<immutable::vector<char,_false,_6>,_true,_5>_>::~ref
            ((ref<immutable::rrb<immutable::vector<char,_false,_6>,_true,_5>_> *)&vec_5);
  immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
            ((ref<immutable::rrb<char,_false,_6>_> *)&lookups);
  immutable::rrb_create<char,false,6>();
  immutable::rrb_create<char,false,6>();
  immutable::transient_vector<char,_false,_6>::transient_vector
            ((transient_vector<char,_false,_6> *)&vec1,
             (ref<immutable::rrb<char,_false,_6>_> *)&list_10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&v3,"Dit is mijn eerste lijntje ",(allocator<char> *)&v);
  vVar13 = v3;
  for (lVar24 = 0; CONCAT44(uStack_2bc,local_2c0) != lVar24; lVar24 = lVar24 + 1) {
    immutable::transient_vector<char,_false,_6>::push_back
              ((transient_vector<char,_false,_6> *)&vec1,
               *(value_type *)((long)vVar13._impl.ptr + lVar24));
  }
  immutable::vector<char,_false,_6>::vector
            ((vector<char,_false,_6> *)&v,(ref<immutable::transient_rrb<char,_false,_6>_> *)&vec1);
  immutable::ref<immutable::rrb<char,_false,_6>_>::operator=
            ((ref<immutable::rrb<char,_false,_6>_> *)&list_10,
             (ref<immutable::rrb<char,_false,_6>_> *)&v);
  immutable::ref<immutable::rrb<char,_false,_6>_>::~ref((ref<immutable::rrb<char,_false,_6>_> *)&v);
  vec2._impl.ptr =
       (ref<immutable::rrb<int,_false,_6>_>)
       (ref<immutable::rrb<int,_false,_6>_>)
       list_10.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  if (list_10.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    list_10.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [8] = list_10.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[8] + 1;
  }
  immutable::vector<char,_false,_6>::insert
            ((vector<char,_false,_6> *)&v,(size_type_conflict)&list4,(vector<char,_false,_6> *)0x0);
  immutable::ref<immutable::rrb<char,_false,_6>_>::operator=
            ((ref<immutable::rrb<char,_false,_6>_> *)&list4,
             (ref<immutable::rrb<char,_false,_6>_> *)&v);
  immutable::ref<immutable::rrb<char,_false,_6>_>::~ref((ref<immutable::rrb<char,_false,_6>_> *)&v);
  immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
            ((ref<immutable::rrb<char,_false,_6>_> *)&vec2);
  immutable::rrb_create<char,false,6>();
  immutable::transient_vector<char,_false,_6>::transient_vector
            ((transient_vector<char,_false,_6> *)&vec4,(ref<immutable::rrb<char,_false,_6>_> *)&vec3
            );
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&lookups,"Dit is mijn tweede lijntje ",(allocator<char> *)&v);
  puVar19 = lookups.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start;
  for (puVar20 = (pointer)0x0;
      lookups.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar20; puVar20 = (pointer)((long)puVar20 + 1)) {
    immutable::transient_vector<char,_false,_6>::push_back
              ((transient_vector<char,_false,_6> *)&vec4,
               *(value_type *)((long)puVar19 + (long)puVar20));
  }
  immutable::vector<char,_false,_6>::vector
            ((vector<char,_false,_6> *)&v,(ref<immutable::transient_rrb<char,_false,_6>_> *)&vec4);
  immutable::ref<immutable::rrb<char,_false,_6>_>::operator=
            ((ref<immutable::rrb<char,_false,_6>_> *)&vec3,
             (ref<immutable::rrb<char,_false,_6>_> *)&v);
  immutable::ref<immutable::rrb<char,_false,_6>_>::~ref((ref<immutable::rrb<char,_false,_6>_> *)&v);
  sVar2 = immutable::vector<char,_false,_6>::size((vector<char,_false,_6> *)&list4);
  vec_11 = vec3;
  if (vec3._impl.ptr != (rrb<int,_false,_6> *)0x0) {
    *(int *)((long)vec3._impl.ptr + 0x20) = *(int *)((long)vec3._impl.ptr + 0x20) + 1;
  }
  immutable::vector<char,_false,_6>::insert
            ((vector<char,_false,_6> *)&v,(size_type_conflict)&list4,
             (vector<char,_false,_6> *)(ulong)sVar2);
  immutable::ref<immutable::rrb<char,_false,_6>_>::operator=
            ((ref<immutable::rrb<char,_false,_6>_> *)&list4,
             (ref<immutable::rrb<char,_false,_6>_> *)&v);
  immutable::ref<immutable::rrb<char,_false,_6>_>::~ref((ref<immutable::rrb<char,_false,_6>_> *)&v);
  immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
            ((ref<immutable::rrb<char,_false,_6>_> *)&vec_11);
  immutable::rrb_create<char,false,6>();
  immutable::vector<char,_false,_6>::push_back((vector<char,_false,_6> *)&v,(value_type)&tvec_3);
  immutable::ref<immutable::rrb<char,_false,_6>_>::operator=
            ((ref<immutable::rrb<char,_false,_6>_> *)&tvec_3,
             (ref<immutable::rrb<char,_false,_6>_> *)&v);
  immutable::ref<immutable::rrb<char,_false,_6>_>::~ref((ref<immutable::rrb<char,_false,_6>_> *)&v);
  immutable::vector<char,_false,_6>::push_back((vector<char,_false,_6> *)&v,(value_type)&tvec_3);
  immutable::ref<immutable::rrb<char,_false,_6>_>::operator=
            ((ref<immutable::rrb<char,_false,_6>_> *)&tvec_3,
             (ref<immutable::rrb<char,_false,_6>_> *)&v);
  immutable::ref<immutable::rrb<char,_false,_6>_>::~ref((ref<immutable::rrb<char,_false,_6>_> *)&v);
  immutable::vector<char,_false,_6>::push_back((vector<char,_false,_6> *)&v,(value_type)&tvec_3);
  immutable::ref<immutable::rrb<char,_false,_6>_>::operator=
            ((ref<immutable::rrb<char,_false,_6>_> *)&tvec_3,
             (ref<immutable::rrb<char,_false,_6>_> *)&v);
  immutable::ref<immutable::rrb<char,_false,_6>_>::~ref((ref<immutable::rrb<char,_false,_6>_> *)&v);
  immutable::vector<char,_false,_6>::push_back((vector<char,_false,_6> *)&v,(value_type)&tvec_3);
  immutable::ref<immutable::rrb<char,_false,_6>_>::operator=
            ((ref<immutable::rrb<char,_false,_6>_> *)&tvec_3,
             (ref<immutable::rrb<char,_false,_6>_> *)&v);
  immutable::ref<immutable::rrb<char,_false,_6>_>::~ref((ref<immutable::rrb<char,_false,_6>_> *)&v);
  immutable::vector<char,_false,_6>::push_back((vector<char,_false,_6> *)&v,(value_type)&tvec_3);
  immutable::ref<immutable::rrb<char,_false,_6>_>::operator=
            ((ref<immutable::rrb<char,_false,_6>_> *)&tvec_3,
             (ref<immutable::rrb<char,_false,_6>_> *)&v);
  immutable::ref<immutable::rrb<char,_false,_6>_>::~ref((ref<immutable::rrb<char,_false,_6>_> *)&v);
  immutable::vector<char,_false,_6>::push_back((vector<char,_false,_6> *)&v,(value_type)&tvec_3);
  immutable::ref<immutable::rrb<char,_false,_6>_>::operator=
            ((ref<immutable::rrb<char,_false,_6>_> *)&tvec_3,
             (ref<immutable::rrb<char,_false,_6>_> *)&v);
  immutable::ref<immutable::rrb<char,_false,_6>_>::~ref((ref<immutable::rrb<char,_false,_6>_> *)&v);
  immutable::vector<char,_false,_6>::erase
            ((vector<char,_false,_6> *)&v,(size_type_conflict)&list4,0);
  immutable::ref<immutable::rrb<char,_false,_6>_>::operator=
            ((ref<immutable::rrb<char,_false,_6>_> *)&list4,
             (ref<immutable::rrb<char,_false,_6>_> *)&v);
  immutable::ref<immutable::rrb<char,_false,_6>_>::~ref((ref<immutable::rrb<char,_false,_6>_> *)&v);
  local_40 = tvec_3._impl.ptr;
  if (tvec_3._impl.ptr != (transient_rrb<int,_false,_6> *)0x0) {
    *(int *)((long)tvec_3._impl.ptr + 0x20) = *(int *)((long)tvec_3._impl.ptr + 0x20) + 1;
  }
  immutable::vector<char,_false,_6>::insert
            ((vector<char,_false,_6> *)&v,(size_type_conflict)&list4,(vector<char,_false,_6> *)0x0);
  immutable::ref<immutable::rrb<char,_false,_6>_>::operator=
            ((ref<immutable::rrb<char,_false,_6>_> *)&list4,
             (ref<immutable::rrb<char,_false,_6>_> *)&v);
  immutable::ref<immutable::rrb<char,_false,_6>_>::~ref((ref<immutable::rrb<char,_false,_6>_> *)&v);
  immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
            ((ref<immutable::rrb<char,_false,_6>_> *)&local_40);
  immutable::vector<char,_false,_6>::set
            ((vector<char,_false,_6> *)&v,(size_type_conflict)&tvec_3,'\0');
  immutable::ref<immutable::rrb<char,_false,_6>_>::operator=
            ((ref<immutable::rrb<char,_false,_6>_> *)&tvec_3,
             (ref<immutable::rrb<char,_false,_6>_> *)&v);
  immutable::ref<immutable::rrb<char,_false,_6>_>::~ref((ref<immutable::rrb<char,_false,_6>_> *)&v);
  immutable::vector<char,_false,_6>::erase
            ((vector<char,_false,_6> *)&v,(size_type_conflict)&list4,0x1e);
  immutable::ref<immutable::rrb<char,_false,_6>_>::operator=
            ((ref<immutable::rrb<char,_false,_6>_> *)&list4,
             (ref<immutable::rrb<char,_false,_6>_> *)&v);
  immutable::ref<immutable::rrb<char,_false,_6>_>::~ref((ref<immutable::rrb<char,_false,_6>_> *)&v);
  local_48 = tvec_3._impl.ptr;
  if (tvec_3._impl.ptr != (transient_rrb<int,_false,_6> *)0x0) {
    *(int *)((long)tvec_3._impl.ptr + 0x20) = *(int *)((long)tvec_3._impl.ptr + 0x20) + 1;
  }
  immutable::vector<char,_false,_6>::insert
            ((vector<char,_false,_6> *)&v,(size_type_conflict)&list4,(vector<char,_false,_6> *)0x1e)
  ;
  immutable::ref<immutable::rrb<char,_false,_6>_>::operator=
            ((ref<immutable::rrb<char,_false,_6>_> *)&list4,
             (ref<immutable::rrb<char,_false,_6>_> *)&v);
  immutable::ref<immutable::rrb<char,_false,_6>_>::~ref((ref<immutable::rrb<char,_false,_6>_> *)&v);
  immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
            ((ref<immutable::rrb<char,_false,_6>_> *)&local_48);
  std::__cxx11::stringstream::stringstream((stringstream *)&v);
  vVar13._impl.ptr =
       (ref<immutable::rrb<int,_false,_6>_>)
       (ref<immutable::rrb<int,_false,_6>_>)
       list4.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  vec_5._impl.ptr =
       (ref<immutable::rrb<int,_false,_6>_>)
       (ref<immutable::rrb<int,_false,_6>_>)
       list4.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  if (list4.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    list4.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[8]
         = list4.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[8] + 1;
  }
  local_280 = 0;
  immutable::vector_iterator<char,_false,_6>::vector_iterator
            ((vector_iterator<char,_false,_6> *)&old_vec,&list4);
  while ((local_280 != local_238 || (vVar13._impl.ptr != old_vec._impl.ptr))) {
    pcVar10 = immutable::vector_iterator<char,_false,_6>::operator*
                        ((vector_iterator<char,_false,_6> *)&vec_5);
    std::operator<<((ostream *)&local_1c0,*pcVar10);
    local_280 = local_280 + 1;
    vVar13 = vec_5;
  }
  immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
            ((ref<immutable::rrb<char,_false,_6>_> *)&old_vec);
  immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
            ((ref<immutable::rrb<char,_false,_6>_> *)&vec_5);
  std::__cxx11::stringbuf::str();
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &vec_5,"1. Dit is mijn eerste lijntje 2. Dit is mijn tweede lijntje ");
  TestEq<bool,bool>(true,bVar1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                    ,0x3ea,
                    "void (anonymous namespace)::test_vector_bug_1() [atomic_ref_counting = false, N = 6]"
                   );
  std::__cxx11::string::~string((string *)&vec_5);
  std::__cxx11::stringstream::~stringstream((stringstream *)&v);
  immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
            ((ref<immutable::rrb<char,_false,_6>_> *)&tvec_3);
  std::__cxx11::string::~string((string *)&lookups);
  immutable::ref<immutable::transient_rrb<char,_false,_6>_>::~ref
            ((ref<immutable::transient_rrb<char,_false,_6>_> *)&vec4);
  immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
            ((ref<immutable::rrb<char,_false,_6>_> *)&vec3);
  std::__cxx11::string::~string((string *)&v3);
  immutable::ref<immutable::transient_rrb<char,_false,_6>_>::~ref
            ((ref<immutable::transient_rrb<char,_false,_6>_> *)&vec1);
  immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
            ((ref<immutable::rrb<char,_false,_6>_> *)&list_10);
  immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
            ((ref<immutable::rrb<char,_false,_6>_> *)&list4);
  immutable::rrb_create<char,false,6>();
  immutable::transient_vector<char,_false,_6>::transient_vector
            ((transient_vector<char,_false,_6> *)&lookups,
             (ref<immutable::rrb<char,_false,_6>_> *)&v3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&v,
             "sdflkjkljdsflkjasd;lkfjsadlkfja;sdlkfj;asdlkfjsld;kfjls;dakfjlwefjlwkedflskxnvnv;laskdjfl;kwejfrl;kjsad;lfkfj;lwkejf"
             ,(allocator<char> *)&vec_5);
  vVar13 = v;
  for (pvVar21 = (pointer)0x0; local_1c8 != (rrb<int,_false,_6> *)pvVar21;
      pvVar21 = (pointer)((long)&(pvVar21->_impl).ptr + 1)) {
    immutable::transient_vector<char,_false,_6>::push_back
              ((transient_vector<char,_false,_6> *)&lookups,
               *(value_type *)((long)&(pvVar21->_impl).ptr + (long)vVar13._impl.ptr));
  }
  immutable::vector<char,_false,_6>::vector
            ((vector<char,_false,_6> *)&vec_5,
             (ref<immutable::transient_rrb<char,_false,_6>_> *)&lookups);
  immutable::ref<immutable::rrb<char,_false,_6>_>::operator=
            ((ref<immutable::rrb<char,_false,_6>_> *)&v3,
             (ref<immutable::rrb<char,_false,_6>_> *)&vec_5);
  immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
            ((ref<immutable::rrb<char,_false,_6>_> *)&vec_5);
  vec_5 = v3;
  if (v3._impl.ptr != (rrb<int,_false,_6> *)0x0) {
    *(int *)((long)v3._impl.ptr + 0x20) = *(int *)((long)v3._impl.ptr + 0x20) + 1;
  }
  bVar1 = immutable::validate_rrb<char,false,6>((ref<immutable::rrb<char,_false,_6>_> *)&vec_5);
  TestEq<bool,bool>(true,bVar1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                    ,0x3fa,
                    "void (anonymous namespace)::test_bug_concat() [atomic_ref_counting = false, N = 6]"
                   );
  immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
            ((ref<immutable::rrb<char,_false,_6>_> *)&vec_5);
  immutable::vector<char,_false,_6>::insert((vector<char,_false,_6> *)&vec_5,pos,'\0');
  immutable::ref<immutable::rrb<char,_false,_6>_>::operator=
            ((ref<immutable::rrb<char,_false,_6>_> *)&v3,
             (ref<immutable::rrb<char,_false,_6>_> *)&vec_5);
  immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
            ((ref<immutable::rrb<char,_false,_6>_> *)&vec_5);
  immutable::vector<char,_false,_6>::insert((vector<char,_false,_6> *)&vec_5,pos,'\0');
  immutable::ref<immutable::rrb<char,_false,_6>_>::operator=
            ((ref<immutable::rrb<char,_false,_6>_> *)&v3,
             (ref<immutable::rrb<char,_false,_6>_> *)&vec_5);
  immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
            ((ref<immutable::rrb<char,_false,_6>_> *)&vec_5);
  immutable::vector<char,_false,_6>::insert((vector<char,_false,_6> *)&vec_5,pos,'\0');
  immutable::ref<immutable::rrb<char,_false,_6>_>::operator=
            ((ref<immutable::rrb<char,_false,_6>_> *)&v3,
             (ref<immutable::rrb<char,_false,_6>_> *)&vec_5);
  immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
            ((ref<immutable::rrb<char,_false,_6>_> *)&vec_5);
  immutable::vector<char,_false,_6>::insert((vector<char,_false,_6> *)&vec_5,pos,'\0');
  immutable::ref<immutable::rrb<char,_false,_6>_>::operator=
            ((ref<immutable::rrb<char,_false,_6>_> *)&v3,
             (ref<immutable::rrb<char,_false,_6>_> *)&vec_5);
  immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
            ((ref<immutable::rrb<char,_false,_6>_> *)&vec_5);
  immutable::vector<char,_false,_6>::insert((vector<char,_false,_6> *)&vec_5,pos,'\0');
  immutable::ref<immutable::rrb<char,_false,_6>_>::operator=
            ((ref<immutable::rrb<char,_false,_6>_> *)&v3,
             (ref<immutable::rrb<char,_false,_6>_> *)&vec_5);
  immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
            ((ref<immutable::rrb<char,_false,_6>_> *)&vec_5);
  vec_5 = v3;
  if (v3._impl.ptr != (rrb<int,_false,_6> *)0x0) {
    *(int *)((long)v3._impl.ptr + 0x20) = *(int *)((long)v3._impl.ptr + 0x20) + 1;
  }
  bVar1 = immutable::validate_rrb<char,false,6>((ref<immutable::rrb<char,_false,_6>_> *)&vec_5);
  TestEq<bool,bool>(true,bVar1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                    ,0x402,
                    "void (anonymous namespace)::test_bug_concat() [atomic_ref_counting = false, N = 6]"
                   );
  immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
            ((ref<immutable::rrb<char,_false,_6>_> *)&vec_5);
  immutable::vector<char,_false,_6>::take((vector<char,_false,_6> *)&vec_5,pos);
  immutable::vector<char,_false,_6>::drop((vector<char,_false,_6> *)&old_vec,pos);
  list4.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)v3._impl.ptr;
  if (v3._impl.ptr != (rrb<int,_false,_6> *)0x0) {
    *(int *)((long)v3._impl.ptr + 0x20) = *(int *)((long)v3._impl.ptr + 0x20) + 1;
  }
  bVar1 = immutable::validate_rrb<char,false,6>((ref<immutable::rrb<char,_false,_6>_> *)&list4);
  TestEq<bool,bool>(true,bVar1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                    ,0x407,
                    "void (anonymous namespace)::test_bug_concat() [atomic_ref_counting = false, N = 6]"
                   );
  immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
            ((ref<immutable::rrb<char,_false,_6>_> *)&list4);
  list4.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)vec_5._impl.ptr;
  if (vec_5._impl.ptr != (rrb<int,_false,_6> *)0x0) {
    *(int *)((long)vec_5._impl.ptr + 0x20) = *(int *)((long)vec_5._impl.ptr + 0x20) + 1;
  }
  bVar1 = immutable::validate_rrb<char,false,6>((ref<immutable::rrb<char,_false,_6>_> *)&list4);
  TestEq<bool,bool>(true,bVar1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                    ,0x408,
                    "void (anonymous namespace)::test_bug_concat() [atomic_ref_counting = false, N = 6]"
                   );
  immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
            ((ref<immutable::rrb<char,_false,_6>_> *)&list4);
  list4.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)old_vec._impl.ptr;
  if (old_vec._impl.ptr != (rrb<int,_false,_6> *)0x0) {
    *(int *)((long)old_vec._impl.ptr + 0x20) = *(int *)((long)old_vec._impl.ptr + 0x20) + 1;
  }
  bVar1 = immutable::validate_rrb<char,false,6>((ref<immutable::rrb<char,_false,_6>_> *)&list4);
  TestEq<bool,bool>(true,bVar1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                    ,0x409,
                    "void (anonymous namespace)::test_bug_concat() [atomic_ref_counting = false, N = 6]"
                   );
  immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
            ((ref<immutable::rrb<char,_false,_6>_> *)&list4);
  immutable::operator+
            ((immutable *)&list4,(vector<char,_false,_6> *)&vec_5,(vector<char,_false,_6> *)&old_vec
            );
  list_10.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       list4.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  if (list4.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    list4.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[8]
         = list4.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[8] + 1;
  }
  bVar1 = immutable::validate_rrb<char,false,6>((ref<immutable::rrb<char,_false,_6>_> *)&list_10);
  TestEq<bool,bool>(true,bVar1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                    ,0x40d,
                    "void (anonymous namespace)::test_bug_concat() [atomic_ref_counting = false, N = 6]"
                   );
  immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
            ((ref<immutable::rrb<char,_false,_6>_> *)&list_10);
  immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
            ((ref<immutable::rrb<char,_false,_6>_> *)&list4);
  immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
            ((ref<immutable::rrb<char,_false,_6>_> *)&old_vec);
  immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
            ((ref<immutable::rrb<char,_false,_6>_> *)&vec_5);
  std::__cxx11::string::~string((string *)&v);
  immutable::ref<immutable::transient_rrb<char,_false,_6>_>::~ref
            ((ref<immutable::transient_rrb<char,_false,_6>_> *)&lookups);
  immutable::ref<immutable::rrb<char,_false,_6>_>::~ref((ref<immutable::rrb<char,_false,_6>_> *)&v3)
  ;
  return;
}

Assistant:

void run_tests()
    {        
    test_empty_vector<atomic_ref_counting, N>();
    test_push_back_simple<atomic_ref_counting, N>();
    test_push_back<atomic_ref_counting, N>();
    test_front<atomic_ref_counting, N>();
    test_back<atomic_ref_counting, N>();
    test_size<atomic_ref_counting, N>();
    test_pop_back<atomic_ref_counting, N>();
    test_update<atomic_ref_counting, N>();
    test_erase_single<atomic_ref_counting, N>();
    test_erase<atomic_ref_counting, N>(200, 50);
    test_insert_single<atomic_ref_counting, N>();
    test_concat<atomic_ref_counting, N>(200);
    test_drop<atomic_ref_counting, N>();
    test_take<atomic_ref_counting, N>();
    test_iterator<atomic_ref_counting, N>();
    test_iterator_2<atomic_ref_counting, N>();
    test_iterator_3<atomic_ref_counting, N>();
    test_reverse_iterator<atomic_ref_counting, N>();
    test_vector_equality<atomic_ref_counting, N>();
    test_insert_vector<atomic_ref_counting, N>();
    test_transient_vector_push<atomic_ref_counting, N>();
    test_transient_vector_pop<atomic_ref_counting, N>();
    test_transient_vector_update<atomic_ref_counting, N>();
    test_transient_vector_push_2<atomic_ref_counting, N>();
    test_transient_iterator<atomic_ref_counting, N>();
    test_transient_iterator_2<atomic_ref_counting, N>();
    test_transient_iterator_3<atomic_ref_counting, N>();
    test_transient_reverse_iterator<atomic_ref_counting, N>();
    test_catslice<atomic_ref_counting, N>();
    test_fibocat<atomic_ref_counting, N>();
    test_invalid_states<atomic_ref_counting, N>();
    test_erase<atomic_ref_counting, N>();
    test_concat<atomic_ref_counting, N>();    
    test_vector_of_vector<atomic_ref_counting, N>();
    test_vector_bug_1<atomic_ref_counting, N>();
    test_bug_concat<atomic_ref_counting, N>();
    }